

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  int iVar47;
  uint uVar48;
  uint uVar49;
  long lVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined4 uVar58;
  undefined8 in_R10;
  float fVar59;
  float fVar60;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar133;
  float fVar143;
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar159;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar180;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar192;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar185 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar193;
  undefined1 auVar191 [32];
  float fVar197;
  float fVar208;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar209;
  float fVar225;
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  vfloat4 a0_3;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  vfloat4 a0_1;
  undefined1 auVar246 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar245 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar264;
  float fVar265;
  vfloat4 a0;
  float fVar266;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar269 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar280 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_720 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  uint local_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar50;
  undefined1 auVar279 [32];
  
  PVar3 = prim[1];
  uVar55 = (ulong)(byte)PVar3;
  fVar59 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar61._0_4_ = fVar59 * auVar9._0_4_;
  auVar61._4_4_ = fVar59 * auVar9._4_4_;
  auVar61._8_4_ = fVar59 * auVar9._8_4_;
  auVar61._12_4_ = fVar59 * auVar9._12_4_;
  auVar144._0_4_ = fVar59 * auVar10._0_4_;
  auVar144._4_4_ = fVar59 * auVar10._4_4_;
  auVar144._8_4_ = fVar59 * auVar10._8_4_;
  auVar144._12_4_ = fVar59 * auVar10._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xc + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x12 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x13 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0x14 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar267._4_4_ = auVar144._0_4_;
  auVar267._0_4_ = auVar144._0_4_;
  auVar267._8_4_ = auVar144._0_4_;
  auVar267._12_4_ = auVar144._0_4_;
  auVar89 = vshufps_avx(auVar144,auVar144,0x55);
  auVar246 = vshufps_avx(auVar144,auVar144,0xaa);
  fVar59 = auVar246._0_4_;
  auVar227._0_4_ = fVar59 * auVar125._0_4_;
  fVar84 = auVar246._4_4_;
  auVar227._4_4_ = fVar84 * auVar125._4_4_;
  fVar86 = auVar246._8_4_;
  auVar227._8_4_ = fVar86 * auVar125._8_4_;
  fVar118 = auVar246._12_4_;
  auVar227._12_4_ = fVar118 * auVar125._12_4_;
  auVar210._0_4_ = auVar14._0_4_ * fVar59;
  auVar210._4_4_ = auVar14._4_4_ * fVar84;
  auVar210._8_4_ = auVar14._8_4_ * fVar86;
  auVar210._12_4_ = auVar14._12_4_ * fVar118;
  auVar181._0_4_ = auVar107._0_4_ * fVar59;
  auVar181._4_4_ = auVar107._4_4_ * fVar84;
  auVar181._8_4_ = auVar107._8_4_ * fVar86;
  auVar181._12_4_ = auVar107._12_4_ * fVar118;
  auVar246 = vfmadd231ps_fma(auVar227,auVar89,auVar10);
  auVar108 = vfmadd231ps_fma(auVar210,auVar89,auVar13);
  auVar89 = vfmadd231ps_fma(auVar181,auVar62,auVar89);
  auVar119 = vfmadd231ps_fma(auVar246,auVar267,auVar9);
  auVar108 = vfmadd231ps_fma(auVar108,auVar267,auVar12);
  auVar135 = vfmadd231ps_fma(auVar89,auVar63,auVar267);
  auVar268._4_4_ = auVar61._0_4_;
  auVar268._0_4_ = auVar61._0_4_;
  auVar268._8_4_ = auVar61._0_4_;
  auVar268._12_4_ = auVar61._0_4_;
  auVar89 = vshufps_avx(auVar61,auVar61,0x55);
  auVar246 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar59 = auVar246._0_4_;
  auVar122._0_4_ = fVar59 * auVar125._0_4_;
  fVar84 = auVar246._4_4_;
  auVar122._4_4_ = fVar84 * auVar125._4_4_;
  fVar86 = auVar246._8_4_;
  auVar122._8_4_ = fVar86 * auVar125._8_4_;
  fVar118 = auVar246._12_4_;
  auVar122._12_4_ = fVar118 * auVar125._12_4_;
  auVar239._0_4_ = auVar14._0_4_ * fVar59;
  auVar239._4_4_ = auVar14._4_4_ * fVar84;
  auVar239._8_4_ = auVar14._8_4_ * fVar86;
  auVar239._12_4_ = auVar14._12_4_ * fVar118;
  auVar246._0_4_ = auVar107._0_4_ * fVar59;
  auVar246._4_4_ = auVar107._4_4_ * fVar84;
  auVar246._8_4_ = auVar107._8_4_ * fVar86;
  auVar246._12_4_ = auVar107._12_4_ * fVar118;
  auVar10 = vfmadd231ps_fma(auVar122,auVar89,auVar10);
  auVar125 = vfmadd231ps_fma(auVar239,auVar89,auVar13);
  auVar13 = vfmadd231ps_fma(auVar246,auVar89,auVar62);
  auVar14 = vfmadd231ps_fma(auVar10,auVar268,auVar9);
  auVar62 = vfmadd231ps_fma(auVar125,auVar268,auVar12);
  auVar107 = vfmadd231ps_fma(auVar13,auVar268,auVar63);
  local_500._8_4_ = 0x7fffffff;
  local_500._0_8_ = 0x7fffffff7fffffff;
  local_500._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar119,local_500);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar10 = vblendvps_avx(auVar119,auVar134,auVar9);
  auVar9 = vandps_avx(auVar108,local_500);
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar125 = vblendvps_avx(auVar108,auVar134,auVar9);
  auVar9 = vandps_avx(local_500,auVar135);
  auVar9 = vcmpps_avx(auVar9,auVar134,1);
  auVar9 = vblendvps_avx(auVar135,auVar134,auVar9);
  auVar12 = vrcpps_avx(auVar10);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = 0x3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar12,auVar182);
  auVar12 = vfmadd132ps_fma(auVar10,auVar12,auVar12);
  auVar10 = vrcpps_avx(auVar125);
  auVar125 = vfnmadd213ps_fma(auVar125,auVar10,auVar182);
  auVar13 = vfmadd132ps_fma(auVar125,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar9);
  auVar125 = vfnmadd213ps_fma(auVar9,auVar10,auVar182);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar63 = vfmadd132ps_fma(auVar125,auVar10,auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar14);
  auVar135._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar135._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar135._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar135._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vsubps_avx(auVar9,auVar14);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + uVar55 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar125);
  auVar145._0_4_ = auVar12._0_4_ * auVar10._0_4_;
  auVar145._4_4_ = auVar12._4_4_ * auVar10._4_4_;
  auVar145._8_4_ = auVar12._8_4_ * auVar10._8_4_;
  auVar145._12_4_ = auVar12._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar160._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar160._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar160._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar160._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar108._1_3_ = 0;
  auVar108[0] = PVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar62);
  auVar89._0_4_ = auVar13._0_4_ * auVar9._0_4_;
  auVar89._4_4_ = auVar13._4_4_ * auVar9._4_4_;
  auVar89._8_4_ = auVar13._8_4_ * auVar9._8_4_;
  auVar89._12_4_ = auVar13._12_4_ * auVar9._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar55 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar13);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vsubps_avx(auVar9,auVar107);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar14);
  auVar119._0_4_ = auVar63._0_4_ * auVar10._0_4_;
  auVar119._4_4_ = auVar63._4_4_ * auVar10._4_4_;
  auVar119._8_4_ = auVar63._8_4_ * auVar10._8_4_;
  auVar119._12_4_ = auVar63._12_4_ * auVar10._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar107);
  auVar62._0_4_ = auVar63._0_4_ * auVar9._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar9._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar9._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar135,auVar145);
  auVar10 = vpminsd_avx(auVar160,auVar89);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vpminsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar211._4_4_ = uVar58;
  auVar211._0_4_ = uVar58;
  auVar211._8_4_ = uVar58;
  auVar211._12_4_ = uVar58;
  auVar10 = vmaxps_avx(auVar10,auVar211);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  local_490._0_4_ = auVar9._0_4_ * 0.99999964;
  local_490._4_4_ = auVar9._4_4_ * 0.99999964;
  local_490._8_4_ = auVar9._8_4_ * 0.99999964;
  local_490._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar135,auVar145);
  auVar10 = vpmaxsd_avx(auVar160,auVar89);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar10 = vpmaxsd_avx(auVar119,auVar62);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar107._4_4_ = uVar58;
  auVar107._0_4_ = uVar58;
  auVar107._8_4_ = uVar58;
  auVar107._12_4_ = uVar58;
  auVar10 = vminps_avx(auVar10,auVar107);
  auVar9 = vminps_avx(auVar9,auVar10);
  auVar108[4] = PVar3;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar3;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar3;
  auVar108._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar108,_DAT_01f4ad30);
  auVar63._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar9 = vcmpps_avx(local_490,auVar63,2);
  auVar9 = vandps_avx(auVar9,auVar10);
  uVar58 = vmovmskps_avx(auVar9);
  uVar55 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar58);
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  iVar47 = 1 << ((uint)k & 0x1f);
  auVar80._4_4_ = iVar47;
  auVar80._0_4_ = iVar47;
  auVar80._8_4_ = iVar47;
  auVar80._12_4_ = iVar47;
  auVar80._16_4_ = iVar47;
  auVar80._20_4_ = iVar47;
  auVar80._24_4_ = iVar47;
  auVar80._28_4_ = iVar47;
  auVar16 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar79 = vpand_avx2(auVar80,auVar16);
  local_360 = vpcmpeqd_avx2(auVar79,auVar16);
LAB_011357f6:
  if (uVar55 == 0) {
    return;
  }
  lVar51 = 0;
  for (uVar57 = uVar55; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar51 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar49].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar14 = *(undefined1 (*) [16])(_Var8 + uVar57 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar57 + 1) * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar57 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar57 + 3));
  fVar59 = *pfVar1;
  fVar84 = pfVar1[1];
  fVar86 = pfVar1[2];
  fVar118 = pfVar1[3];
  lVar51 = *(long *)&pGVar5[1].time_range.upper;
  auVar125 = *(undefined1 (*) [16])(lVar51 + (long)p_Var6 * uVar57);
  auVar12 = *(undefined1 (*) [16])(lVar51 + (long)p_Var6 * (uVar57 + 1));
  auVar13 = *(undefined1 (*) [16])(lVar51 + (long)p_Var6 * (uVar57 + 2));
  uVar55 = uVar55 - 1 & uVar55;
  pfVar1 = (float *)(lVar51 + (long)p_Var6 * (uVar57 + 3));
  fVar158 = *pfVar1;
  fVar178 = pfVar1[1];
  fVar179 = pfVar1[2];
  fVar180 = pfVar1[3];
  if (uVar55 != 0) {
    uVar56 = uVar55 - 1 & uVar55;
    for (uVar57 = uVar55; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar63 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar63 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar90._0_4_ = fVar158 * 0.0;
  auVar90._4_4_ = fVar178 * 0.0;
  auVar90._8_4_ = fVar179 * 0.0;
  auVar90._12_4_ = fVar180 * 0.0;
  auVar269._8_4_ = 0x3e2aaaab;
  auVar269._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar269._12_4_ = 0x3e2aaaab;
  auVar62 = vfmadd213ps_fma(auVar269,auVar13,auVar90);
  auVar198._8_4_ = 0x3f2aaaab;
  auVar198._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar198._12_4_ = 0x3f2aaaab;
  auVar62 = vfmadd231ps_fma(auVar62,auVar12,auVar198);
  auVar107 = vfmadd231ps_fma(auVar62,auVar125,auVar269);
  auVar64._8_4_ = 0x3f000000;
  auVar64._0_8_ = 0x3f0000003f000000;
  auVar64._12_4_ = 0x3f000000;
  auVar62 = vfmadd231ps_fma(auVar90,auVar13,auVar64);
  auVar62 = vfnmadd231ps_fma(auVar62,auVar12,ZEXT816(0) << 0x40);
  auVar246 = vfnmadd231ps_fma(auVar62,auVar125,auVar64);
  auVar243._0_4_ = fVar59 * 0.0;
  auVar243._4_4_ = fVar84 * 0.0;
  auVar243._8_4_ = fVar86 * 0.0;
  auVar243._12_4_ = fVar118 * 0.0;
  auVar135 = ZEXT816(0) << 0x40;
  auVar62 = vfmadd213ps_fma(auVar269,auVar10,auVar243);
  auVar62 = vfmadd231ps_fma(auVar62,auVar9,auVar198);
  auVar62 = vfmadd231ps_fma(auVar62,auVar14,auVar269);
  auVar89 = vfmadd231ps_fma(auVar243,auVar10,auVar64);
  auVar89 = vfnmadd231ps_fma(auVar89,auVar9,auVar135);
  auVar108 = vfnmadd231ps_fma(auVar89,auVar14,auVar64);
  auVar120._0_4_ = fVar158 * 0.16666667;
  auVar120._4_4_ = fVar178 * 0.16666667;
  auVar120._8_4_ = fVar179 * 0.16666667;
  auVar120._12_4_ = fVar180 * 0.16666667;
  auVar89 = vfmadd231ps_fma(auVar120,auVar13,auVar198);
  auVar89 = vfmadd231ps_fma(auVar89,auVar12,auVar269);
  auVar89 = vfmadd231ps_fma(auVar89,auVar125,auVar135);
  auVar136._0_4_ = fVar158 * 0.5;
  auVar136._4_4_ = fVar178 * 0.5;
  auVar136._8_4_ = fVar179 * 0.5;
  auVar136._12_4_ = fVar180 * 0.5;
  auVar13 = vfmadd231ps_fma(auVar136,auVar135,auVar13);
  auVar12 = vfnmadd231ps_fma(auVar13,auVar64,auVar12);
  auVar119 = vfnmadd231ps_fma(auVar12,auVar135,auVar125);
  auVar212._0_4_ = fVar59 * 0.16666667;
  auVar212._4_4_ = fVar84 * 0.16666667;
  auVar212._8_4_ = fVar86 * 0.16666667;
  auVar212._12_4_ = fVar118 * 0.16666667;
  auVar109._8_4_ = 0x3f2aaaab;
  auVar109._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar109._12_4_ = 0x3f2aaaab;
  auVar125 = vfmadd231ps_fma(auVar212,auVar10,auVar109);
  auVar125 = vfmadd231ps_fma(auVar125,auVar9,auVar269);
  auVar13 = vfmadd231ps_fma(auVar125,auVar14,auVar135);
  auVar228._0_4_ = fVar59 * 0.5;
  auVar228._4_4_ = fVar84 * 0.5;
  auVar228._8_4_ = fVar86 * 0.5;
  auVar228._12_4_ = fVar118 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar228,auVar135,auVar10);
  auVar9 = vfnmadd231ps_fma(auVar10,auVar64,auVar9);
  auVar135 = vfnmadd231ps_fma(auVar9,auVar135,auVar14);
  auVar9 = vshufps_avx(auVar246,auVar246,0xc9);
  auVar10 = vshufps_avx(auVar62,auVar62,0xc9);
  fVar85 = auVar246._0_4_;
  auVar161._0_4_ = fVar85 * auVar10._0_4_;
  fVar87 = auVar246._4_4_;
  auVar161._4_4_ = fVar87 * auVar10._4_4_;
  fVar60 = auVar246._8_4_;
  auVar161._8_4_ = fVar60 * auVar10._8_4_;
  fVar159 = auVar246._12_4_;
  auVar161._12_4_ = fVar159 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar161,auVar9,auVar62);
  auVar125 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar162._0_4_ = fVar85 * auVar10._0_4_;
  auVar162._4_4_ = fVar87 * auVar10._4_4_;
  auVar162._8_4_ = fVar60 * auVar10._8_4_;
  auVar162._12_4_ = fVar159 * auVar10._12_4_;
  auVar9 = vfmsub231ps_fma(auVar162,auVar9,auVar108);
  auVar12 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar10 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar9 = vshufps_avx(auVar13,auVar13,0xc9);
  fVar226 = auVar119._0_4_;
  auVar146._0_4_ = fVar226 * auVar9._0_4_;
  fVar132 = auVar119._4_4_;
  auVar146._4_4_ = fVar132 * auVar9._4_4_;
  fVar133 = auVar119._8_4_;
  auVar146._8_4_ = fVar133 * auVar9._8_4_;
  fVar143 = auVar119._12_4_;
  auVar146._12_4_ = fVar143 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar146,auVar10,auVar13);
  auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar14 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar9 = vdpps_avx(auVar125,auVar125,0x7f);
  auVar183._0_4_ = fVar226 * auVar14._0_4_;
  auVar183._4_4_ = fVar132 * auVar14._4_4_;
  auVar183._8_4_ = fVar133 * auVar14._8_4_;
  auVar183._12_4_ = fVar143 * auVar14._12_4_;
  auVar10 = vfmsub231ps_fma(auVar183,auVar10,auVar135);
  auVar14 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar84 = auVar9._0_4_;
  auVar62 = ZEXT416((uint)fVar84);
  auVar10 = vrsqrtss_avx(auVar62,auVar62);
  fVar59 = auVar10._0_4_;
  fVar59 = fVar59 * 1.5 + fVar84 * -0.5 * fVar59 * fVar59 * fVar59;
  auVar10 = vdpps_avx(auVar125,auVar12,0x7f);
  fVar158 = auVar125._0_4_ * fVar59;
  fVar178 = auVar125._4_4_ * fVar59;
  fVar179 = auVar125._8_4_ * fVar59;
  fVar180 = auVar125._12_4_ * fVar59;
  auVar238._0_4_ = auVar12._0_4_ * fVar84;
  auVar238._4_4_ = auVar12._4_4_ * fVar84;
  auVar238._8_4_ = auVar12._8_4_ * fVar84;
  auVar238._12_4_ = auVar12._12_4_ * fVar84;
  fVar84 = auVar10._0_4_;
  auVar199._0_4_ = auVar125._0_4_ * fVar84;
  auVar199._4_4_ = auVar125._4_4_ * fVar84;
  auVar199._8_4_ = auVar125._8_4_ * fVar84;
  auVar199._12_4_ = auVar125._12_4_ * fVar84;
  auVar125 = vsubps_avx(auVar238,auVar199);
  auVar10 = vrcpss_avx(auVar62,auVar62);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar86 = auVar10._0_4_ * auVar9._0_4_;
  auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar118 = auVar9._0_4_;
  auVar62 = ZEXT416((uint)fVar118);
  auVar10 = vrsqrtss_avx(auVar62,auVar62);
  fVar84 = auVar10._0_4_;
  fVar84 = fVar84 * 1.5 + fVar118 * -0.5 * fVar84 * fVar84 * fVar84;
  auVar10 = vdpps_avx(auVar13,auVar14,0x7f);
  fVar255 = fVar84 * auVar13._0_4_;
  fVar264 = fVar84 * auVar13._4_4_;
  fVar265 = fVar84 * auVar13._8_4_;
  fVar266 = fVar84 * auVar13._12_4_;
  auVar184._0_4_ = fVar118 * auVar14._0_4_;
  auVar184._4_4_ = fVar118 * auVar14._4_4_;
  auVar184._8_4_ = fVar118 * auVar14._8_4_;
  auVar184._12_4_ = fVar118 * auVar14._12_4_;
  fVar118 = auVar10._0_4_;
  auVar147._0_4_ = fVar118 * auVar13._0_4_;
  auVar147._4_4_ = fVar118 * auVar13._4_4_;
  auVar147._8_4_ = fVar118 * auVar13._8_4_;
  auVar147._12_4_ = fVar118 * auVar13._12_4_;
  auVar12 = vsubps_avx(auVar184,auVar147);
  auVar10 = vrcpss_avx(auVar62,auVar62);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar10,ZEXT416(0x40000000));
  fVar118 = auVar9._0_4_ * auVar10._0_4_;
  auVar9 = vshufps_avx(auVar107,auVar107,0xff);
  auVar213._0_4_ = auVar9._0_4_ * fVar158;
  auVar213._4_4_ = auVar9._4_4_ * fVar178;
  auVar213._8_4_ = auVar9._8_4_ * fVar179;
  auVar213._12_4_ = auVar9._12_4_ * fVar180;
  local_540 = vsubps_avx(auVar107,auVar213);
  auVar10 = vshufps_avx(auVar246,auVar246,0xff);
  auVar163._0_4_ = auVar10._0_4_ * fVar158 + fVar59 * auVar125._0_4_ * fVar86 * auVar9._0_4_;
  auVar163._4_4_ = auVar10._4_4_ * fVar178 + fVar59 * auVar125._4_4_ * fVar86 * auVar9._4_4_;
  auVar163._8_4_ = auVar10._8_4_ * fVar179 + fVar59 * auVar125._8_4_ * fVar86 * auVar9._8_4_;
  auVar163._12_4_ = auVar10._12_4_ * fVar180 + fVar59 * auVar125._12_4_ * fVar86 * auVar9._12_4_;
  auVar125 = vsubps_avx(auVar246,auVar163);
  local_550._0_4_ = auVar107._0_4_ + auVar213._0_4_;
  local_550._4_4_ = auVar107._4_4_ + auVar213._4_4_;
  fStack_548 = auVar107._8_4_ + auVar213._8_4_;
  fStack_544 = auVar107._12_4_ + auVar213._12_4_;
  auVar9 = vshufps_avx(auVar89,auVar89,0xff);
  auVar110._0_4_ = fVar255 * auVar9._0_4_;
  auVar110._4_4_ = fVar264 * auVar9._4_4_;
  auVar110._8_4_ = fVar265 * auVar9._8_4_;
  auVar110._12_4_ = fVar266 * auVar9._12_4_;
  local_560 = vsubps_avx(auVar89,auVar110);
  auVar10 = vshufps_avx(auVar119,auVar119,0xff);
  auVar91._0_4_ = fVar255 * auVar10._0_4_ + auVar9._0_4_ * fVar84 * auVar12._0_4_ * fVar118;
  auVar91._4_4_ = fVar264 * auVar10._4_4_ + auVar9._4_4_ * fVar84 * auVar12._4_4_ * fVar118;
  auVar91._8_4_ = fVar265 * auVar10._8_4_ + auVar9._8_4_ * fVar84 * auVar12._8_4_ * fVar118;
  auVar91._12_4_ = fVar266 * auVar10._12_4_ + auVar9._12_4_ * fVar84 * auVar12._12_4_ * fVar118;
  auVar9 = vsubps_avx(auVar119,auVar91);
  fVar158 = auVar89._0_4_ + auVar110._0_4_;
  fVar178 = auVar89._4_4_ + auVar110._4_4_;
  fVar179 = auVar89._8_4_ + auVar110._8_4_;
  fVar180 = auVar89._12_4_ + auVar110._12_4_;
  local_570._0_4_ = local_540._0_4_ + auVar125._0_4_ * 0.33333334;
  local_570._4_4_ = local_540._4_4_ + auVar125._4_4_ * 0.33333334;
  local_570._8_4_ = local_540._8_4_ + auVar125._8_4_ * 0.33333334;
  local_570._12_4_ = local_540._12_4_ + auVar125._12_4_ * 0.33333334;
  auVar92._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar92._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar92._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar92._12_4_ = auVar9._12_4_ * 0.33333334;
  local_580 = vsubps_avx(local_560,auVar92);
  local_520 = vsubps_avx(local_540,auVar63);
  auVar9 = vshufps_avx(local_520,local_520,0x55);
  auVar10 = vshufps_avx(local_520,local_520,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar59 = pre->ray_space[k].vz.field_0.m128[0];
  fVar84 = pre->ray_space[k].vz.field_0.m128[1];
  fVar86 = pre->ray_space[k].vz.field_0.m128[2];
  fVar118 = pre->ray_space[k].vz.field_0.m128[3];
  auVar93._0_4_ = fVar59 * auVar10._0_4_;
  auVar93._4_4_ = fVar84 * auVar10._4_4_;
  auVar93._8_4_ = fVar86 * auVar10._8_4_;
  auVar93._12_4_ = fVar118 * auVar10._12_4_;
  auVar125 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar2,auVar9);
  local_530 = vsubps_avx(local_570,auVar63);
  auVar9 = vshufps_avx(local_530,local_530,0x55);
  auVar10 = vshufps_avx(local_530,local_530,0xaa);
  auVar275._0_4_ = fVar59 * auVar10._0_4_;
  auVar275._4_4_ = fVar84 * auVar10._4_4_;
  auVar275._8_4_ = fVar86 * auVar10._8_4_;
  auVar275._12_4_ = fVar118 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar275,(undefined1  [16])aVar2,auVar9);
  local_3e0 = vsubps_avx(local_580,auVar63);
  auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar244._0_4_ = fVar59 * auVar9._0_4_;
  auVar244._4_4_ = fVar84 * auVar9._4_4_;
  auVar244._8_4_ = fVar86 * auVar9._8_4_;
  auVar244._12_4_ = fVar118 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar12 = vfmadd231ps_fma(auVar244,(undefined1  [16])aVar2,auVar9);
  local_3f0 = vsubps_avx(local_560,auVar63);
  auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar256._0_4_ = fVar59 * auVar9._0_4_;
  auVar256._4_4_ = fVar84 * auVar9._4_4_;
  auVar256._8_4_ = fVar86 * auVar9._8_4_;
  auVar256._12_4_ = fVar118 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar13 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar2,auVar9);
  local_400 = vsubps_avx(_local_550,auVar63);
  auVar9 = vshufps_avx(local_400,local_400,0xaa);
  auVar148._0_4_ = fVar59 * auVar9._0_4_;
  auVar148._4_4_ = fVar84 * auVar9._4_4_;
  auVar148._8_4_ = fVar86 * auVar9._8_4_;
  auVar148._12_4_ = fVar118 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_400,local_400,0x55);
  auVar14 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar2,auVar9);
  local_590._0_4_ = (fVar85 + auVar163._0_4_) * 0.33333334 + (float)local_550._0_4_;
  local_590._4_4_ = (fVar87 + auVar163._4_4_) * 0.33333334 + (float)local_550._4_4_;
  fStack_588 = (fVar60 + auVar163._8_4_) * 0.33333334 + fStack_548;
  fStack_584 = (fVar159 + auVar163._12_4_) * 0.33333334 + fStack_544;
  local_410 = vsubps_avx(_local_590,auVar63);
  auVar9 = vshufps_avx(local_410,local_410,0xaa);
  auVar200._0_4_ = auVar9._0_4_ * fVar59;
  auVar200._4_4_ = auVar9._4_4_ * fVar84;
  auVar200._8_4_ = auVar9._8_4_ * fVar86;
  auVar200._12_4_ = auVar9._12_4_ * fVar118;
  auVar9 = vshufps_avx(local_410,local_410,0x55);
  auVar62 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar2,auVar9);
  auVar214._0_4_ = (fVar226 + auVar91._0_4_) * 0.33333334;
  auVar214._4_4_ = (fVar132 + auVar91._4_4_) * 0.33333334;
  auVar214._8_4_ = (fVar133 + auVar91._8_4_) * 0.33333334;
  auVar214._12_4_ = (fVar143 + auVar91._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar178;
  auVar43._0_4_ = fVar158;
  auVar43._8_4_ = fVar179;
  auVar43._12_4_ = fVar180;
  _local_5a0 = vsubps_avx(auVar43,auVar214);
  local_420 = vsubps_avx(_local_5a0,auVar63);
  auVar9 = vshufps_avx(local_420,local_420,0xaa);
  auVar215._0_4_ = auVar9._0_4_ * fVar59;
  auVar215._4_4_ = auVar9._4_4_ * fVar84;
  auVar215._8_4_ = auVar9._8_4_ * fVar86;
  auVar215._12_4_ = auVar9._12_4_ * fVar118;
  auVar9 = vshufps_avx(local_420,local_420,0x55);
  auVar107 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar9);
  local_430 = vsubps_avx(auVar43,auVar63);
  auVar9 = vshufps_avx(local_430,local_430,0xaa);
  auVar65._0_4_ = fVar59 * auVar9._0_4_;
  auVar65._4_4_ = fVar84 * auVar9._4_4_;
  auVar65._8_4_ = fVar86 * auVar9._8_4_;
  auVar65._12_4_ = fVar118 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_430,local_430,0x55);
  auVar9 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar2,auVar9);
  auVar164._4_4_ = local_520._0_4_;
  auVar164._0_4_ = local_520._0_4_;
  auVar164._8_4_ = local_520._0_4_;
  auVar164._12_4_ = local_520._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar63 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar2,auVar164);
  auVar165._4_4_ = local_530._0_4_;
  auVar165._0_4_ = local_530._0_4_;
  auVar165._8_4_ = local_530._0_4_;
  auVar165._12_4_ = local_530._0_4_;
  auVar89 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar165);
  uVar58 = local_3e0._0_4_;
  auVar166._4_4_ = uVar58;
  auVar166._0_4_ = uVar58;
  auVar166._8_4_ = uVar58;
  auVar166._12_4_ = uVar58;
  auVar246 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar166);
  uVar58 = local_3f0._0_4_;
  auVar167._4_4_ = uVar58;
  auVar167._0_4_ = uVar58;
  auVar167._8_4_ = uVar58;
  auVar167._12_4_ = uVar58;
  auVar108 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar167);
  uVar58 = local_400._0_4_;
  auVar168._4_4_ = uVar58;
  auVar168._0_4_ = uVar58;
  auVar168._8_4_ = uVar58;
  auVar168._12_4_ = uVar58;
  auVar119 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar2,auVar168);
  uVar58 = local_410._0_4_;
  auVar169._4_4_ = uVar58;
  auVar169._0_4_ = uVar58;
  auVar169._8_4_ = uVar58;
  auVar169._12_4_ = uVar58;
  auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar169);
  uVar58 = local_420._0_4_;
  auVar170._4_4_ = uVar58;
  auVar170._0_4_ = uVar58;
  auVar170._8_4_ = uVar58;
  auVar170._12_4_ = uVar58;
  auVar107 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar170);
  uVar58 = local_430._0_4_;
  auVar171._4_4_ = uVar58;
  auVar171._0_4_ = uVar58;
  auVar171._8_4_ = uVar58;
  auVar171._12_4_ = uVar58;
  auVar135 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar171);
  auVar12 = vmovlhps_avx(auVar63,auVar119);
  auVar13 = vmovlhps_avx(auVar89,auVar62);
  auVar14 = vmovlhps_avx(auVar246,auVar107);
  _local_3c0 = vmovlhps_avx(auVar108,auVar135);
  auVar9 = vminps_avx(auVar12,auVar13);
  auVar10 = vminps_avx(auVar14,_local_3c0);
  auVar125 = vminps_avx(auVar9,auVar10);
  auVar9 = vmaxps_avx(auVar12,auVar13);
  auVar10 = vmaxps_avx(auVar14,_local_3c0);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vshufpd_avx(auVar125,auVar125,3);
  auVar125 = vminps_avx(auVar125,auVar10);
  auVar10 = vshufpd_avx(auVar9,auVar9,3);
  auVar10 = vmaxps_avx(auVar9,auVar10);
  auVar9 = vandps_avx(local_500,auVar125);
  auVar10 = vandps_avx(local_500,auVar10);
  auVar9 = vmaxps_avx(auVar9,auVar10);
  auVar10 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar10,auVar9);
  local_1c0 = auVar9._0_4_ * 9.536743e-07;
  auVar185._8_8_ = auVar63._0_8_;
  auVar185._0_8_ = auVar63._0_8_;
  auVar229._8_8_ = auVar89._0_8_;
  auVar229._0_8_ = auVar89._0_8_;
  auVar245._0_8_ = auVar246._0_8_;
  auVar245._8_8_ = auVar245._0_8_;
  auVar257._0_8_ = auVar108._0_8_;
  auVar257._8_8_ = auVar257._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  local_510 = 0x80000000;
  uStack_50c = 0x80000000;
  uStack_508 = 0x80000000;
  uStack_504 = 0x80000000;
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar49;
  uStack_31c = uVar49;
  uStack_318 = uVar49;
  uStack_314 = uVar49;
  uStack_310 = uVar49;
  uStack_30c = uVar49;
  uStack_308 = uVar49;
  uStack_304 = uVar49;
  local_340 = uVar4;
  uStack_33c = uVar4;
  uStack_338 = uVar4;
  uStack_334 = uVar4;
  uStack_330 = uVar4;
  uStack_32c = uVar4;
  uStack_328 = uVar4;
  uStack_324 = uVar4;
  uVar57 = 0;
  fVar59 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar13,auVar12);
  local_3a0 = vsubps_avx(auVar14,auVar13);
  local_3b0 = vsubps_avx(_local_3c0,auVar14);
  local_450 = vsubps_avx(_local_550,local_540);
  local_460 = vsubps_avx(_local_590,local_570);
  local_470 = vsubps_avx(_local_5a0,local_580);
  auVar44._4_4_ = fVar178;
  auVar44._0_4_ = fVar158;
  auVar44._8_4_ = fVar179;
  auVar44._12_4_ = fVar180;
  _local_480 = vsubps_avx(auVar44,local_560);
  auVar66 = ZEXT816(0x3f80000000000000);
  local_440 = auVar66;
LAB_0113600a:
  auVar9 = vshufps_avx(auVar66,auVar66,0x50);
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = 0x3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar279._16_4_ = 0x3f800000;
  auVar279._0_16_ = auVar276;
  auVar279._20_4_ = 0x3f800000;
  auVar279._24_4_ = 0x3f800000;
  auVar279._28_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar276,auVar9);
  fVar84 = auVar9._0_4_;
  fVar133 = auVar119._0_4_;
  auVar67._0_4_ = fVar133 * fVar84;
  fVar86 = auVar9._4_4_;
  fVar143 = auVar119._4_4_;
  auVar67._4_4_ = fVar143 * fVar86;
  fVar118 = auVar9._8_4_;
  auVar67._8_4_ = fVar133 * fVar118;
  fVar85 = auVar9._12_4_;
  auVar67._12_4_ = fVar143 * fVar85;
  fVar255 = auVar62._0_4_;
  auVar172._0_4_ = fVar255 * fVar84;
  fVar264 = auVar62._4_4_;
  auVar172._4_4_ = fVar264 * fVar86;
  auVar172._8_4_ = fVar255 * fVar118;
  auVar172._12_4_ = fVar264 * fVar85;
  fVar197 = auVar107._0_4_;
  auVar137._0_4_ = fVar197 * fVar84;
  fVar208 = auVar107._4_4_;
  auVar137._4_4_ = fVar208 * fVar86;
  auVar137._8_4_ = fVar197 * fVar118;
  auVar137._12_4_ = fVar208 * fVar85;
  fVar209 = auVar135._0_4_;
  auVar111._0_4_ = fVar209 * fVar84;
  fVar225 = auVar135._4_4_;
  auVar111._4_4_ = fVar225 * fVar86;
  auVar111._8_4_ = fVar209 * fVar118;
  auVar111._12_4_ = fVar225 * fVar85;
  auVar89 = vfmadd231ps_fma(auVar67,auVar10,auVar185);
  auVar246 = vfmadd231ps_fma(auVar172,auVar10,auVar229);
  auVar108 = vfmadd231ps_fma(auVar137,auVar10,auVar245);
  auVar61 = vfmadd231ps_fma(auVar111,auVar257,auVar10);
  auVar9 = vmovshdup_avx(local_440);
  fVar84 = local_440._0_4_;
  fStack_288 = (auVar9._0_4_ - fVar84) * 0.04761905;
  auVar223._4_4_ = fVar84;
  auVar223._0_4_ = fVar84;
  auVar223._8_4_ = fVar84;
  auVar223._12_4_ = fVar84;
  auVar223._16_4_ = fVar84;
  auVar223._20_4_ = fVar84;
  auVar223._24_4_ = fVar84;
  auVar223._28_4_ = fVar84;
  auVar103._0_8_ = auVar9._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  auVar79 = vsubps_avx(auVar103,auVar223);
  uVar58 = auVar89._0_4_;
  auVar273._4_4_ = uVar58;
  auVar273._0_4_ = uVar58;
  auVar273._8_4_ = uVar58;
  auVar273._12_4_ = uVar58;
  auVar273._16_4_ = uVar58;
  auVar273._20_4_ = uVar58;
  auVar273._24_4_ = uVar58;
  auVar273._28_4_ = uVar58;
  auVar9 = vmovshdup_avx(auVar89);
  uVar88 = auVar9._0_8_;
  auVar263._8_8_ = uVar88;
  auVar263._0_8_ = uVar88;
  auVar263._16_8_ = uVar88;
  auVar263._24_8_ = uVar88;
  fVar132 = auVar246._0_4_;
  auVar252._4_4_ = fVar132;
  auVar252._0_4_ = fVar132;
  auVar252._8_4_ = fVar132;
  auVar252._12_4_ = fVar132;
  auVar252._16_4_ = fVar132;
  auVar252._20_4_ = fVar132;
  auVar252._24_4_ = fVar132;
  auVar252._28_4_ = fVar132;
  auVar10 = vmovshdup_avx(auVar246);
  auVar104._0_8_ = auVar10._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  fVar226 = auVar108._0_4_;
  auVar189._4_4_ = fVar226;
  auVar189._0_4_ = fVar226;
  auVar189._8_4_ = fVar226;
  auVar189._12_4_ = fVar226;
  auVar189._16_4_ = fVar226;
  auVar189._20_4_ = fVar226;
  auVar189._24_4_ = fVar226;
  auVar189._28_4_ = fVar226;
  auVar125 = vmovshdup_avx(auVar108);
  auVar206._0_8_ = auVar125._0_8_;
  auVar206._8_8_ = auVar206._0_8_;
  auVar206._16_8_ = auVar206._0_8_;
  auVar206._24_8_ = auVar206._0_8_;
  fVar159 = auVar61._0_4_;
  auVar63 = vmovshdup_avx(auVar61);
  auVar239 = vfmadd132ps_fma(auVar79,auVar223,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar279,ZEXT1632(auVar239));
  fVar84 = auVar239._0_4_;
  fVar86 = auVar239._4_4_;
  auVar16._4_4_ = fVar132 * fVar86;
  auVar16._0_4_ = fVar132 * fVar84;
  fVar118 = auVar239._8_4_;
  auVar16._8_4_ = fVar132 * fVar118;
  fVar85 = auVar239._12_4_;
  auVar16._12_4_ = fVar132 * fVar85;
  auVar16._16_4_ = fVar132 * 0.0;
  auVar16._20_4_ = fVar132 * 0.0;
  auVar16._24_4_ = fVar132 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar239 = vfmadd231ps_fma(auVar16,auVar79,auVar273);
  fVar87 = auVar10._0_4_;
  fVar60 = auVar10._4_4_;
  auVar15._4_4_ = fVar60 * fVar86;
  auVar15._0_4_ = fVar87 * fVar84;
  auVar15._8_4_ = fVar87 * fVar118;
  auVar15._12_4_ = fVar60 * fVar85;
  auVar15._16_4_ = fVar87 * 0.0;
  auVar15._20_4_ = fVar60 * 0.0;
  auVar15._24_4_ = fVar87 * 0.0;
  auVar15._28_4_ = uVar58;
  auVar134 = vfmadd231ps_fma(auVar15,auVar79,auVar263);
  auVar11._4_4_ = fVar226 * fVar86;
  auVar11._0_4_ = fVar226 * fVar84;
  auVar11._8_4_ = fVar226 * fVar118;
  auVar11._12_4_ = fVar226 * fVar85;
  auVar11._16_4_ = fVar226 * 0.0;
  auVar11._20_4_ = fVar226 * 0.0;
  auVar11._24_4_ = fVar226 * 0.0;
  auVar11._28_4_ = auVar9._4_4_;
  auVar144 = vfmadd231ps_fma(auVar11,auVar79,auVar252);
  fVar87 = auVar125._0_4_;
  fVar60 = auVar125._4_4_;
  auVar17._4_4_ = fVar60 * fVar86;
  auVar17._0_4_ = fVar87 * fVar84;
  auVar17._8_4_ = fVar87 * fVar118;
  auVar17._12_4_ = fVar60 * fVar85;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar60 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = fVar132;
  auVar122 = vfmadd231ps_fma(auVar17,auVar79,auVar104);
  auVar9 = vshufps_avx(auVar89,auVar89,0xaa);
  local_720._8_8_ = auVar9._0_8_;
  local_720._0_8_ = local_720._8_8_;
  local_720._16_8_ = local_720._8_8_;
  local_720._24_8_ = local_720._8_8_;
  auVar10 = vshufps_avx(auVar89,auVar89,0xff);
  uStack_778 = auVar10._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar18._4_4_ = fVar159 * fVar86;
  auVar18._0_4_ = fVar159 * fVar84;
  auVar18._8_4_ = fVar159 * fVar118;
  auVar18._12_4_ = fVar159 * fVar85;
  auVar18._16_4_ = fVar159 * 0.0;
  auVar18._20_4_ = fVar159 * 0.0;
  auVar18._24_4_ = fVar159 * 0.0;
  auVar18._28_4_ = fVar159;
  auVar89 = vfmadd231ps_fma(auVar18,auVar79,auVar189);
  auVar10 = vshufps_avx(auVar246,auVar246,0xaa);
  auVar190._0_8_ = auVar10._0_8_;
  auVar190._8_8_ = auVar190._0_8_;
  auVar190._16_8_ = auVar190._0_8_;
  auVar190._24_8_ = auVar190._0_8_;
  auVar125 = vshufps_avx(auVar246,auVar246,0xff);
  local_620._8_8_ = auVar125._0_8_;
  local_620._0_8_ = local_620._8_8_;
  local_620._16_8_ = local_620._8_8_;
  local_620._24_8_ = local_620._8_8_;
  fVar87 = auVar63._0_4_;
  fVar60 = auVar63._4_4_;
  auVar19._4_4_ = fVar60 * fVar86;
  auVar19._0_4_ = fVar87 * fVar84;
  auVar19._8_4_ = fVar87 * fVar118;
  auVar19._12_4_ = fVar60 * fVar85;
  auVar19._16_4_ = fVar87 * 0.0;
  auVar19._20_4_ = fVar60 * 0.0;
  auVar19._24_4_ = fVar87 * 0.0;
  auVar19._28_4_ = auVar9._4_4_;
  auVar145 = vfmadd231ps_fma(auVar19,auVar79,auVar206);
  auVar254._28_4_ = fVar60;
  auVar254._0_28_ =
       ZEXT1628(CONCAT412(auVar144._12_4_ * fVar85,
                          CONCAT48(auVar144._8_4_ * fVar118,
                                   CONCAT44(auVar144._4_4_ * fVar86,auVar144._0_4_ * fVar84))));
  auVar239 = vfmadd231ps_fma(auVar254,auVar79,ZEXT1632(auVar239));
  fVar87 = auVar125._4_4_;
  auVar20._28_4_ = fVar87;
  auVar20._0_28_ =
       ZEXT1628(CONCAT412(auVar122._12_4_ * fVar85,
                          CONCAT48(auVar122._8_4_ * fVar118,
                                   CONCAT44(auVar122._4_4_ * fVar86,auVar122._0_4_ * fVar84))));
  auVar134 = vfmadd231ps_fma(auVar20,auVar79,ZEXT1632(auVar134));
  auVar9 = vshufps_avx(auVar108,auVar108,0xaa);
  uVar88 = auVar9._0_8_;
  auVar177._8_8_ = uVar88;
  auVar177._0_8_ = uVar88;
  auVar177._16_8_ = uVar88;
  auVar177._24_8_ = uVar88;
  auVar63 = vshufps_avx(auVar108,auVar108,0xff);
  uVar88 = auVar63._0_8_;
  auVar280._8_8_ = uVar88;
  auVar280._0_8_ = uVar88;
  auVar280._16_8_ = uVar88;
  auVar280._24_8_ = uVar88;
  auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar85,
                                                CONCAT48(auVar89._8_4_ * fVar118,
                                                         CONCAT44(auVar89._4_4_ * fVar86,
                                                                  auVar89._0_4_ * fVar84)))),auVar79
                             ,ZEXT1632(auVar144));
  auVar89 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar246 = vshufps_avx(auVar61,auVar61,0xff);
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar145._12_4_,
                                               CONCAT48(fVar118 * auVar145._8_4_,
                                                        CONCAT44(fVar86 * auVar145._4_4_,
                                                                 fVar84 * auVar145._0_4_)))),auVar79
                            ,ZEXT1632(auVar122));
  auVar144 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar108._12_4_,
                                                CONCAT48(fVar118 * auVar108._8_4_,
                                                         CONCAT44(fVar86 * auVar108._4_4_,
                                                                  fVar84 * auVar108._0_4_)))),
                             auVar79,ZEXT1632(auVar239));
  auVar16 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar239));
  auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar61._12_4_,
                                                CONCAT48(fVar118 * auVar61._8_4_,
                                                         CONCAT44(fVar86 * auVar61._4_4_,
                                                                  fVar84 * auVar61._0_4_)))),auVar79
                             ,ZEXT1632(auVar134));
  auVar80 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar134));
  fVar60 = auVar80._28_4_;
  auVar253._0_4_ = fStack_288 * auVar16._0_4_ * 3.0;
  auVar253._4_4_ = fStack_288 * auVar16._4_4_ * 3.0;
  auVar253._8_4_ = fStack_288 * auVar16._8_4_ * 3.0;
  auVar253._12_4_ = fStack_288 * auVar16._12_4_ * 3.0;
  auVar253._16_4_ = fStack_288 * auVar16._16_4_ * 3.0;
  auVar253._20_4_ = fStack_288 * auVar16._20_4_ * 3.0;
  auVar253._24_4_ = fStack_288 * auVar16._24_4_ * 3.0;
  auVar253._28_4_ = 0;
  local_5c0._0_4_ = fStack_288 * auVar80._0_4_ * 3.0;
  local_5c0._4_4_ = fStack_288 * auVar80._4_4_ * 3.0;
  fStack_5b8 = fStack_288 * auVar80._8_4_ * 3.0;
  fStack_5b4 = fStack_288 * auVar80._12_4_ * 3.0;
  fStack_5b0 = fStack_288 * auVar80._16_4_ * 3.0;
  fStack_5ac = fStack_288 * auVar80._20_4_ * 3.0;
  fStack_5a8 = fStack_288 * auVar80._24_4_ * 3.0;
  fStack_5a4 = fVar60;
  fVar159 = auVar10._0_4_;
  fVar226 = auVar10._4_4_;
  auVar21._4_4_ = fVar226 * fVar86;
  auVar21._0_4_ = fVar159 * fVar84;
  auVar21._8_4_ = fVar159 * fVar118;
  auVar21._12_4_ = fVar226 * fVar85;
  auVar21._16_4_ = fVar159 * 0.0;
  auVar21._20_4_ = fVar226 * 0.0;
  auVar21._24_4_ = fVar159 * 0.0;
  auVar21._28_4_ = fVar60;
  auVar10 = vfmadd231ps_fma(auVar21,auVar79,local_720);
  fVar159 = auVar125._0_4_;
  auVar22._4_4_ = fVar87 * fVar86;
  auVar22._0_4_ = fVar159 * fVar84;
  auVar22._8_4_ = fVar159 * fVar118;
  auVar22._12_4_ = fVar87 * fVar85;
  auVar22._16_4_ = fVar159 * 0.0;
  auVar22._20_4_ = fVar87 * 0.0;
  auVar22._24_4_ = fVar159 * 0.0;
  auVar22._28_4_ = 0;
  auVar125 = vfmadd231ps_fma(auVar22,auVar79,_local_780);
  fVar87 = auVar9._0_4_;
  fVar159 = auVar9._4_4_;
  auVar23._4_4_ = fVar159 * fVar86;
  auVar23._0_4_ = fVar87 * fVar84;
  auVar23._8_4_ = fVar87 * fVar118;
  auVar23._12_4_ = fVar159 * fVar85;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar159 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = auVar16._28_4_;
  auVar9 = vfmadd231ps_fma(auVar23,auVar79,auVar190);
  fVar87 = auVar63._0_4_;
  fVar132 = auVar63._4_4_;
  auVar24._4_4_ = fVar132 * fVar86;
  auVar24._0_4_ = fVar87 * fVar84;
  auVar24._8_4_ = fVar87 * fVar118;
  auVar24._12_4_ = fVar132 * fVar85;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar132 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar226;
  auVar63 = vfmadd231ps_fma(auVar24,auVar79,local_620);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar144));
  fVar87 = auVar89._0_4_;
  fVar159 = auVar89._4_4_;
  auVar25._4_4_ = fVar159 * fVar86;
  auVar25._0_4_ = fVar87 * fVar84;
  auVar25._8_4_ = fVar87 * fVar118;
  auVar25._12_4_ = fVar159 * fVar85;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar159 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar159;
  auVar89 = vfmadd231ps_fma(auVar25,auVar79,auVar177);
  auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar108));
  fVar87 = auVar246._0_4_;
  fVar159 = auVar246._4_4_;
  auVar26._4_4_ = fVar159 * fVar86;
  auVar26._0_4_ = fVar87 * fVar84;
  auVar26._8_4_ = fVar87 * fVar118;
  auVar26._12_4_ = fVar159 * fVar85;
  auVar26._16_4_ = fVar87 * 0.0;
  auVar26._20_4_ = fVar159 * 0.0;
  auVar26._24_4_ = fVar87 * 0.0;
  auVar26._28_4_ = fVar159;
  auVar246 = vfmadd231ps_fma(auVar26,auVar79,auVar280);
  auVar27._28_4_ = fVar132;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar9._12_4_ * fVar85,
                          CONCAT48(auVar9._8_4_ * fVar118,
                                   CONCAT44(auVar9._4_4_ * fVar86,auVar9._0_4_ * fVar84))));
  auVar10 = vfmadd231ps_fma(auVar27,auVar79,ZEXT1632(auVar10));
  auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar63._12_4_,
                                                CONCAT48(fVar118 * auVar63._8_4_,
                                                         CONCAT44(fVar86 * auVar63._4_4_,
                                                                  fVar84 * auVar63._0_4_)))),auVar79
                             ,ZEXT1632(auVar125));
  auVar105._0_4_ = auVar144._0_4_ + auVar253._0_4_;
  auVar105._4_4_ = auVar144._4_4_ + auVar253._4_4_;
  auVar105._8_4_ = auVar144._8_4_ + auVar253._8_4_;
  auVar105._12_4_ = auVar144._12_4_ + auVar253._12_4_;
  auVar105._16_4_ = auVar253._16_4_ + 0.0;
  auVar105._20_4_ = auVar253._20_4_ + 0.0;
  auVar105._24_4_ = auVar253._24_4_ + 0.0;
  auVar105._28_4_ = 0;
  auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar85,
                                              CONCAT48(auVar89._8_4_ * fVar118,
                                                       CONCAT44(auVar89._4_4_ * fVar86,
                                                                auVar89._0_4_ * fVar84)))),auVar79,
                           ZEXT1632(auVar9));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar246._12_4_ * fVar85,
                                               CONCAT48(auVar246._8_4_ * fVar118,
                                                        CONCAT44(auVar246._4_4_ * fVar86,
                                                                 auVar246._0_4_ * fVar84)))),auVar79
                            ,ZEXT1632(auVar63));
  auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar9._12_4_,
                                               CONCAT48(fVar118 * auVar9._8_4_,
                                                        CONCAT44(fVar86 * auVar9._4_4_,
                                                                 fVar84 * auVar9._0_4_)))),auVar79,
                            ZEXT1632(auVar10));
  auVar246 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar63._12_4_ * fVar85,
                                                CONCAT48(auVar63._8_4_ * fVar118,
                                                         CONCAT44(auVar63._4_4_ * fVar86,
                                                                  auVar63._0_4_ * fVar84)))),
                             ZEXT1632(auVar125),auVar79);
  auVar79 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
  auVar16 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar125));
  auVar274._0_4_ = fStack_288 * auVar79._0_4_ * 3.0;
  auVar274._4_4_ = fStack_288 * auVar79._4_4_ * 3.0;
  auVar274._8_4_ = fStack_288 * auVar79._8_4_ * 3.0;
  auVar274._12_4_ = fStack_288 * auVar79._12_4_ * 3.0;
  auVar274._16_4_ = fStack_288 * auVar79._16_4_ * 3.0;
  auVar274._20_4_ = fStack_288 * auVar79._20_4_ * 3.0;
  auVar274._24_4_ = fStack_288 * auVar79._24_4_ * 3.0;
  auVar274._28_4_ = 0;
  local_2a0 = fStack_288 * auVar16._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar16._4_4_ * 3.0;
  auVar28._4_4_ = fStack_29c;
  auVar28._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar16._8_4_ * 3.0;
  auVar28._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar16._12_4_ * 3.0;
  auVar28._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar16._16_4_ * 3.0;
  auVar28._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar16._20_4_ * 3.0;
  auVar28._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar16._24_4_ * 3.0;
  auVar28._24_4_ = fStack_288;
  auVar28._28_4_ = 0x40400000;
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar89));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar246));
  auVar79 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar144));
  auVar16 = vsubps_avx(ZEXT1632(auVar246),ZEXT1632(auVar108));
  auVar80 = vsubps_avx(auVar19,auVar17);
  fVar265 = auVar79._0_4_ + auVar80._0_4_;
  fVar266 = auVar79._4_4_ + auVar80._4_4_;
  fVar192 = auVar79._8_4_ + auVar80._8_4_;
  fVar193 = auVar79._12_4_ + auVar80._12_4_;
  fVar194 = auVar79._16_4_ + auVar80._16_4_;
  fVar195 = auVar79._20_4_ + auVar80._20_4_;
  fVar196 = auVar79._24_4_ + auVar80._24_4_;
  auVar15 = vsubps_avx(local_4e0,auVar18);
  auVar81._0_4_ = auVar16._0_4_ + auVar15._0_4_;
  auVar81._4_4_ = auVar16._4_4_ + auVar15._4_4_;
  auVar81._8_4_ = auVar16._8_4_ + auVar15._8_4_;
  auVar81._12_4_ = auVar16._12_4_ + auVar15._12_4_;
  auVar81._16_4_ = auVar16._16_4_ + auVar15._16_4_;
  auVar81._20_4_ = auVar16._20_4_ + auVar15._20_4_;
  auVar81._24_4_ = auVar16._24_4_ + auVar15._24_4_;
  auVar81._28_4_ = auVar16._28_4_ + auVar15._28_4_;
  local_240 = ZEXT1632(auVar108);
  fVar84 = auVar108._0_4_;
  local_2c0 = (float)local_5c0._0_4_ + fVar84;
  fVar86 = auVar108._4_4_;
  fStack_2bc = (float)local_5c0._4_4_ + fVar86;
  fVar118 = auVar108._8_4_;
  fStack_2b8 = fStack_5b8 + fVar118;
  fVar85 = auVar108._12_4_;
  fStack_2b4 = fStack_5b4 + fVar85;
  fStack_2b0 = fStack_5b0 + 0.0;
  fStack_2ac = fStack_5ac + 0.0;
  fStack_2a8 = fStack_5a8 + 0.0;
  local_200 = ZEXT1632(auVar144);
  auVar16 = vsubps_avx(local_200,auVar253);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_240,_local_5c0);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_260._0_4_ = auVar89._0_4_ + auVar274._0_4_;
  local_260._4_4_ = auVar89._4_4_ + auVar274._4_4_;
  local_260._8_4_ = auVar89._8_4_ + auVar274._8_4_;
  local_260._12_4_ = auVar89._12_4_ + auVar274._12_4_;
  local_260._16_4_ = auVar274._16_4_ + 0.0;
  local_260._20_4_ = auVar274._20_4_ + 0.0;
  local_260._24_4_ = auVar274._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar254 = ZEXT1632(auVar89);
  auVar16 = vsubps_avx(auVar254,auVar274);
  _local_5c0 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar87 = auVar246._0_4_;
  local_2a0 = fVar87 + local_2a0;
  fVar159 = auVar246._4_4_;
  fStack_29c = fVar159 + fStack_29c;
  fVar226 = auVar246._8_4_;
  fStack_298 = fVar226 + fStack_298;
  fVar132 = auVar246._12_4_;
  fStack_294 = fVar132 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar246),auVar28);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar29._4_4_ = fVar86 * fVar266;
  auVar29._0_4_ = fVar84 * fVar265;
  auVar29._8_4_ = fVar118 * fVar192;
  auVar29._12_4_ = fVar85 * fVar193;
  auVar29._16_4_ = fVar194 * 0.0;
  auVar29._20_4_ = fVar195 * 0.0;
  auVar29._24_4_ = fVar196 * 0.0;
  auVar29._28_4_ = auVar16._28_4_;
  auVar9 = vfnmadd231ps_fma(auVar29,local_200,auVar81);
  fStack_2a4 = fVar60 + 0.0;
  auVar30._4_4_ = fStack_2bc * fVar266;
  auVar30._0_4_ = local_2c0 * fVar265;
  auVar30._8_4_ = fStack_2b8 * fVar192;
  auVar30._12_4_ = fStack_2b4 * fVar193;
  auVar30._16_4_ = fStack_2b0 * fVar194;
  auVar30._20_4_ = fStack_2ac * fVar195;
  auVar30._24_4_ = fStack_2a8 * fVar196;
  auVar30._28_4_ = 0;
  auVar10 = vfnmadd231ps_fma(auVar30,auVar81,auVar105);
  auVar31._4_4_ = local_2e0._4_4_ * fVar266;
  auVar31._0_4_ = local_2e0._0_4_ * fVar265;
  auVar31._8_4_ = local_2e0._8_4_ * fVar192;
  auVar31._12_4_ = local_2e0._12_4_ * fVar193;
  auVar31._16_4_ = local_2e0._16_4_ * fVar194;
  auVar31._20_4_ = local_2e0._20_4_ * fVar195;
  auVar31._24_4_ = local_2e0._24_4_ * fVar196;
  auVar31._28_4_ = fVar60 + 0.0;
  auVar125 = vfnmadd231ps_fma(auVar31,local_220,auVar81);
  local_780._0_4_ = auVar18._0_4_;
  local_780._4_4_ = auVar18._4_4_;
  uStack_778._0_4_ = auVar18._8_4_;
  uStack_778._4_4_ = auVar18._12_4_;
  uStack_770._0_4_ = auVar18._16_4_;
  uStack_770._4_4_ = auVar18._20_4_;
  uStack_768._0_4_ = auVar18._24_4_;
  uStack_768._4_4_ = auVar18._28_4_;
  auVar32._4_4_ = (float)local_780._4_4_ * fVar266;
  auVar32._0_4_ = (float)local_780._0_4_ * fVar265;
  auVar32._8_4_ = (float)uStack_778 * fVar192;
  auVar32._12_4_ = uStack_778._4_4_ * fVar193;
  auVar32._16_4_ = (float)uStack_770 * fVar194;
  auVar32._20_4_ = uStack_770._4_4_ * fVar195;
  auVar32._24_4_ = (float)uStack_768 * fVar196;
  auVar32._28_4_ = uStack_768._4_4_;
  auVar63 = vfnmadd231ps_fma(auVar32,auVar17,auVar81);
  auVar207._0_4_ = fVar87 * fVar265;
  auVar207._4_4_ = fVar159 * fVar266;
  auVar207._8_4_ = fVar226 * fVar192;
  auVar207._12_4_ = fVar132 * fVar193;
  auVar207._16_4_ = fVar194 * 0.0;
  auVar207._20_4_ = fVar195 * 0.0;
  auVar207._24_4_ = fVar196 * 0.0;
  auVar207._28_4_ = 0;
  auVar89 = vfnmadd231ps_fma(auVar207,auVar254,auVar81);
  uStack_284 = 0x40400000;
  auVar33._4_4_ = fStack_29c * fVar266;
  auVar33._0_4_ = local_2a0 * fVar265;
  auVar33._8_4_ = fStack_298 * fVar192;
  auVar33._12_4_ = fStack_294 * fVar193;
  auVar33._16_4_ = fStack_290 * fVar194;
  auVar33._20_4_ = fStack_28c * fVar195;
  auVar33._24_4_ = fStack_288 * fVar196;
  auVar33._28_4_ = auVar17._28_4_;
  auVar108 = vfnmadd231ps_fma(auVar33,local_260,auVar81);
  auVar34._4_4_ = local_280._4_4_ * fVar266;
  auVar34._0_4_ = local_280._0_4_ * fVar265;
  auVar34._8_4_ = local_280._8_4_ * fVar192;
  auVar34._12_4_ = local_280._12_4_ * fVar193;
  auVar34._16_4_ = local_280._16_4_ * fVar194;
  auVar34._20_4_ = local_280._20_4_ * fVar195;
  auVar34._24_4_ = local_280._24_4_ * fVar196;
  auVar34._28_4_ = local_280._28_4_;
  auVar61 = vfnmadd231ps_fma(auVar34,_local_5c0,auVar81);
  auVar35._4_4_ = local_4e0._4_4_ * fVar266;
  auVar35._0_4_ = local_4e0._0_4_ * fVar265;
  auVar35._8_4_ = local_4e0._8_4_ * fVar192;
  auVar35._12_4_ = local_4e0._12_4_ * fVar193;
  auVar35._16_4_ = local_4e0._16_4_ * fVar194;
  auVar35._20_4_ = local_4e0._20_4_ * fVar195;
  auVar35._24_4_ = local_4e0._24_4_ * fVar196;
  auVar35._28_4_ = auVar79._28_4_ + auVar80._28_4_;
  auVar224 = ZEXT3264(auVar19);
  auVar239 = vfnmadd231ps_fma(auVar35,auVar19,auVar81);
  auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
  auVar79 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
  auVar80 = vminps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
  auVar80 = vminps_avx(auVar16,auVar80);
  auVar16 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
  auVar79 = vmaxps_avx(auVar79,auVar16);
  auVar15 = vminps_avx(ZEXT1632(auVar89),ZEXT1632(auVar108));
  auVar16 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar108));
  auVar11 = vminps_avx(ZEXT1632(auVar61),ZEXT1632(auVar239));
  auVar15 = vminps_avx(auVar15,auVar11);
  auVar15 = vminps_avx(auVar80,auVar15);
  auVar80 = vmaxps_avx(ZEXT1632(auVar61),ZEXT1632(auVar239));
  auVar16 = vmaxps_avx(auVar16,auVar80);
  auVar16 = vmaxps_avx(auVar79,auVar16);
  auVar46._4_4_ = fStack_1bc;
  auVar46._0_4_ = local_1c0;
  auVar46._8_4_ = fStack_1b8;
  auVar46._12_4_ = fStack_1b4;
  auVar46._16_4_ = fStack_1b0;
  auVar46._20_4_ = fStack_1ac;
  auVar46._24_4_ = fStack_1a8;
  auVar46._28_4_ = fStack_1a4;
  auVar79 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_1dc;
  auVar45._0_4_ = local_1e0;
  auVar45._8_4_ = fStack_1d8;
  auVar45._12_4_ = fStack_1d4;
  auVar45._16_4_ = fStack_1d0;
  auVar45._20_4_ = fStack_1cc;
  auVar45._24_4_ = fStack_1c8;
  auVar45._28_4_ = fStack_1c4;
  auVar16 = vcmpps_avx(auVar16,auVar45,5);
  auVar79 = vandps_avx(auVar16,auVar79);
  auVar16 = local_300 & auVar79;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(auVar17,local_200);
    auVar80 = vsubps_avx(auVar19,auVar254);
    fVar265 = auVar16._0_4_ + auVar80._0_4_;
    fVar266 = auVar16._4_4_ + auVar80._4_4_;
    fVar192 = auVar16._8_4_ + auVar80._8_4_;
    fVar193 = auVar16._12_4_ + auVar80._12_4_;
    fVar194 = auVar16._16_4_ + auVar80._16_4_;
    fVar195 = auVar16._20_4_ + auVar80._20_4_;
    fVar196 = auVar16._24_4_ + auVar80._24_4_;
    auVar15 = vsubps_avx(auVar18,local_240);
    auVar11 = vsubps_avx(local_4e0,ZEXT1632(auVar246));
    auVar106._0_4_ = auVar15._0_4_ + auVar11._0_4_;
    auVar106._4_4_ = auVar15._4_4_ + auVar11._4_4_;
    auVar106._8_4_ = auVar15._8_4_ + auVar11._8_4_;
    auVar106._12_4_ = auVar15._12_4_ + auVar11._12_4_;
    auVar106._16_4_ = auVar15._16_4_ + auVar11._16_4_;
    auVar106._20_4_ = auVar15._20_4_ + auVar11._20_4_;
    auVar106._24_4_ = auVar15._24_4_ + auVar11._24_4_;
    fVar60 = auVar11._28_4_;
    auVar106._28_4_ = auVar15._28_4_ + fVar60;
    auVar36._4_4_ = fVar86 * fVar266;
    auVar36._0_4_ = fVar84 * fVar265;
    auVar36._8_4_ = fVar118 * fVar192;
    auVar36._12_4_ = fVar85 * fVar193;
    auVar36._16_4_ = fVar194 * 0.0;
    auVar36._20_4_ = fVar195 * 0.0;
    auVar36._24_4_ = fVar196 * 0.0;
    auVar36._28_4_ = local_4e0._28_4_;
    auVar89 = vfnmadd231ps_fma(auVar36,auVar106,local_200);
    auVar37._4_4_ = fVar266 * fStack_2bc;
    auVar37._0_4_ = fVar265 * local_2c0;
    auVar37._8_4_ = fVar192 * fStack_2b8;
    auVar37._12_4_ = fVar193 * fStack_2b4;
    auVar37._16_4_ = fVar194 * fStack_2b0;
    auVar37._20_4_ = fVar195 * fStack_2ac;
    auVar37._24_4_ = fVar196 * fStack_2a8;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(auVar105,auVar106,auVar37);
    auVar38._4_4_ = fVar266 * local_2e0._4_4_;
    auVar38._0_4_ = fVar265 * local_2e0._0_4_;
    auVar38._8_4_ = fVar192 * local_2e0._8_4_;
    auVar38._12_4_ = fVar193 * local_2e0._12_4_;
    auVar38._16_4_ = fVar194 * local_2e0._16_4_;
    auVar38._20_4_ = fVar195 * local_2e0._20_4_;
    auVar38._24_4_ = fVar196 * local_2e0._24_4_;
    auVar38._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_220,auVar106,auVar38);
    auVar39._4_4_ = (float)local_780._4_4_ * fVar266;
    auVar39._0_4_ = (float)local_780._0_4_ * fVar265;
    auVar39._8_4_ = (float)uStack_778 * fVar192;
    auVar39._12_4_ = uStack_778._4_4_ * fVar193;
    auVar39._16_4_ = (float)uStack_770 * fVar194;
    auVar39._20_4_ = uStack_770._4_4_ * fVar195;
    auVar39._24_4_ = (float)uStack_768 * fVar196;
    auVar39._28_4_ = 0;
    auVar246 = vfnmadd231ps_fma(auVar39,auVar106,auVar17);
    auVar130._0_4_ = fVar87 * fVar265;
    auVar130._4_4_ = fVar159 * fVar266;
    auVar130._8_4_ = fVar226 * fVar192;
    auVar130._12_4_ = fVar132 * fVar193;
    auVar130._16_4_ = fVar194 * 0.0;
    auVar130._20_4_ = fVar195 * 0.0;
    auVar130._24_4_ = fVar196 * 0.0;
    auVar130._28_4_ = 0;
    auVar108 = vfnmadd231ps_fma(auVar130,auVar106,auVar254);
    auVar40._4_4_ = fVar266 * fStack_29c;
    auVar40._0_4_ = fVar265 * local_2a0;
    auVar40._8_4_ = fVar192 * fStack_298;
    auVar40._12_4_ = fVar193 * fStack_294;
    auVar40._16_4_ = fVar194 * fStack_290;
    auVar40._20_4_ = fVar195 * fStack_28c;
    auVar40._24_4_ = fVar196 * fStack_288;
    auVar40._28_4_ = fVar60;
    auVar125 = vfnmadd213ps_fma(local_260,auVar106,auVar40);
    auVar41._4_4_ = fVar266 * local_280._4_4_;
    auVar41._0_4_ = fVar265 * local_280._0_4_;
    auVar41._8_4_ = fVar192 * local_280._8_4_;
    auVar41._12_4_ = fVar193 * local_280._12_4_;
    auVar41._16_4_ = fVar194 * local_280._16_4_;
    auVar41._20_4_ = fVar195 * local_280._20_4_;
    auVar41._24_4_ = fVar196 * local_280._24_4_;
    auVar41._28_4_ = fVar60;
    auVar63 = vfnmadd213ps_fma(_local_5c0,auVar106,auVar41);
    auVar224 = ZEXT1664(auVar63);
    auVar42._4_4_ = fVar266 * local_4e0._4_4_;
    auVar42._0_4_ = fVar265 * local_4e0._0_4_;
    auVar42._8_4_ = fVar192 * local_4e0._8_4_;
    auVar42._12_4_ = fVar193 * local_4e0._12_4_;
    auVar42._16_4_ = fVar194 * local_4e0._16_4_;
    auVar42._20_4_ = fVar195 * local_4e0._20_4_;
    auVar42._24_4_ = fVar196 * local_4e0._24_4_;
    auVar42._28_4_ = auVar16._28_4_ + auVar80._28_4_;
    auVar61 = vfnmadd231ps_fma(auVar42,auVar106,auVar19);
    auVar80 = vminps_avx(ZEXT1632(auVar89),ZEXT1632(auVar9));
    auVar16 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar246));
    auVar15 = vminps_avx(auVar80,auVar15);
    auVar80 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar246));
    auVar16 = vmaxps_avx(auVar16,auVar80);
    auVar11 = vminps_avx(ZEXT1632(auVar108),ZEXT1632(auVar125));
    auVar80 = vmaxps_avx(ZEXT1632(auVar108),ZEXT1632(auVar125));
    auVar17 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
    auVar11 = vminps_avx(auVar11,auVar17);
    auVar11 = vminps_avx(auVar15,auVar11);
    auVar15 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar61));
    auVar80 = vmaxps_avx(auVar80,auVar15);
    auVar80 = vmaxps_avx(auVar16,auVar80);
    auVar16 = vcmpps_avx(auVar11,auVar46,2);
    auVar80 = vcmpps_avx(auVar80,auVar45,5);
    auVar16 = vandps_avx(auVar80,auVar16);
    auVar79 = vandps_avx(auVar79,local_300);
    auVar80 = auVar79 & auVar16;
    if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0x7f,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar80 >> 0xbf,0) != '\0') ||
        (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar80[0x1f] < '\0')
    {
      auVar79 = vandps_avx(auVar16,auVar79);
      uVar54 = vmovmskps_avx(auVar79);
      if (uVar54 != 0) {
        auStack_4f0[uVar57] = uVar54 & 0xff;
        uVar88 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar57 * 2) = uVar88;
        uVar56 = vmovlps_avx(auVar66);
        auStack_1a0[uVar57] = uVar56;
        uVar57 = (ulong)((int)uVar57 + 1);
      }
    }
  }
LAB_011365bc:
  if ((int)uVar57 == 0) {
    uVar58 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar78._4_4_ = uVar58;
    auVar78._0_4_ = uVar58;
    auVar78._8_4_ = uVar58;
    auVar78._12_4_ = uVar58;
    auVar9 = vcmpps_avx(local_490,auVar78,2);
    uVar49 = vmovmskps_avx(auVar9);
    uVar55 = (ulong)((uint)uVar55 & uVar49);
    goto LAB_011357f6;
  }
  uVar48 = (int)uVar57 - 1;
  uVar50 = (ulong)uVar48;
  uVar53 = auStack_4f0[uVar50];
  uVar54 = (&uStack_380)[uVar50 * 2];
  fVar84 = afStack_37c[uVar50 * 2];
  iVar47 = 0;
  for (uVar56 = (ulong)uVar53; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    iVar47 = iVar47 + 1;
  }
  uVar53 = uVar53 - 1 & uVar53;
  if (uVar53 == 0) {
    uVar57 = (ulong)uVar48;
  }
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auStack_1a0[uVar50];
  auStack_4f0[uVar50] = uVar53;
  fVar86 = (float)(iVar47 + 1) * 0.14285715;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * (float)iVar47 * 0.14285715)),ZEXT416(uVar54),
                           ZEXT416((uint)(1.0 - (float)iVar47 * 0.14285715)));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar86)),ZEXT416(uVar54),
                            ZEXT416((uint)(1.0 - fVar86)));
  fVar86 = auVar10._0_4_;
  auVar191._0_4_ = auVar9._0_4_;
  fVar84 = fVar86 - auVar191._0_4_;
  if (fVar84 < 0.16666667) {
    auVar125 = vshufps_avx(auVar66,auVar66,0x50);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar63 = vsubps_avx(auVar94,auVar125);
    fVar118 = auVar125._0_4_;
    auVar138._0_4_ = fVar118 * fVar133;
    fVar85 = auVar125._4_4_;
    auVar138._4_4_ = fVar85 * fVar143;
    fVar87 = auVar125._8_4_;
    auVar138._8_4_ = fVar87 * fVar133;
    fVar60 = auVar125._12_4_;
    auVar138._12_4_ = fVar60 * fVar143;
    auVar149._0_4_ = fVar118 * fVar255;
    auVar149._4_4_ = fVar85 * fVar264;
    auVar149._8_4_ = fVar87 * fVar255;
    auVar149._12_4_ = fVar60 * fVar264;
    auVar173._0_4_ = fVar118 * fVar197;
    auVar173._4_4_ = fVar85 * fVar208;
    auVar173._8_4_ = fVar87 * fVar197;
    auVar173._12_4_ = fVar60 * fVar208;
    auVar68._0_4_ = fVar118 * fVar209;
    auVar68._4_4_ = fVar85 * fVar225;
    auVar68._8_4_ = fVar87 * fVar209;
    auVar68._12_4_ = fVar60 * fVar225;
    auVar125 = vfmadd231ps_fma(auVar138,auVar63,auVar185);
    auVar89 = vfmadd231ps_fma(auVar149,auVar63,auVar229);
    auVar246 = vfmadd231ps_fma(auVar173,auVar63,auVar245);
    auVar63 = vfmadd231ps_fma(auVar68,auVar63,auVar257);
    auVar131._16_16_ = auVar125;
    auVar131._0_16_ = auVar125;
    auVar142._16_16_ = auVar89;
    auVar142._0_16_ = auVar89;
    auVar157._16_16_ = auVar246;
    auVar157._0_16_ = auVar246;
    auVar191._4_4_ = auVar191._0_4_;
    auVar191._8_4_ = auVar191._0_4_;
    auVar191._12_4_ = auVar191._0_4_;
    auVar191._20_4_ = fVar86;
    auVar191._16_4_ = fVar86;
    auVar191._24_4_ = fVar86;
    auVar191._28_4_ = fVar86;
    auVar79 = vsubps_avx(auVar142,auVar131);
    auVar89 = vfmadd213ps_fma(auVar79,auVar191,auVar131);
    auVar79 = vsubps_avx(auVar157,auVar142);
    auVar108 = vfmadd213ps_fma(auVar79,auVar191,auVar142);
    auVar125 = vsubps_avx(auVar63,auVar246);
    auVar82._16_16_ = auVar125;
    auVar82._0_16_ = auVar125;
    auVar125 = vfmadd213ps_fma(auVar82,auVar191,auVar157);
    auVar79 = vsubps_avx(ZEXT1632(auVar108),ZEXT1632(auVar89));
    auVar63 = vfmadd213ps_fma(auVar79,auVar191,ZEXT1632(auVar89));
    auVar79 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar108));
    auVar125 = vfmadd213ps_fma(auVar79,auVar191,ZEXT1632(auVar108));
    auVar79 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar63));
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar79,auVar191);
    fVar226 = auVar79._4_4_ * 3.0;
    fVar118 = fVar84 * 0.33333334;
    local_4e0._0_8_ =
         CONCAT44(auVar134._4_4_ + fVar118 * fVar226,auVar134._0_4_ + fVar118 * auVar79._0_4_ * 3.0)
    ;
    local_4e0._8_4_ = auVar134._8_4_ + fVar118 * auVar79._8_4_ * 3.0;
    local_4e0._12_4_ = auVar134._12_4_ + fVar118 * auVar79._12_4_ * 3.0;
    auVar63 = vshufpd_avx(auVar134,auVar134,3);
    auVar89 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar125 = vsubps_avx(auVar63,auVar134);
    auVar246 = vsubps_avx(auVar89,(undefined1  [16])0x0);
    auVar69._0_4_ = auVar125._0_4_ + auVar246._0_4_;
    auVar69._4_4_ = auVar125._4_4_ + auVar246._4_4_;
    auVar69._8_4_ = auVar125._8_4_ + auVar246._8_4_;
    auVar69._12_4_ = auVar125._12_4_ + auVar246._12_4_;
    auVar125 = vshufps_avx(auVar134,auVar134,0xb1);
    auVar246 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
    auVar270._4_4_ = auVar69._0_4_;
    auVar270._0_4_ = auVar69._0_4_;
    auVar270._8_4_ = auVar69._0_4_;
    auVar270._12_4_ = auVar69._0_4_;
    auVar108 = vshufps_avx(auVar69,auVar69,0x55);
    fVar85 = auVar108._0_4_;
    auVar70._0_4_ = fVar85 * auVar125._0_4_;
    fVar87 = auVar108._4_4_;
    auVar70._4_4_ = fVar87 * auVar125._4_4_;
    fVar60 = auVar108._8_4_;
    auVar70._8_4_ = fVar60 * auVar125._8_4_;
    fVar159 = auVar108._12_4_;
    auVar70._12_4_ = fVar159 * auVar125._12_4_;
    auVar150._0_4_ = fVar85 * auVar246._0_4_;
    auVar150._4_4_ = fVar87 * auVar246._4_4_;
    auVar150._8_4_ = fVar60 * auVar246._8_4_;
    auVar150._12_4_ = fVar159 * auVar246._12_4_;
    auVar61 = vfmadd231ps_fma(auVar70,auVar270,auVar134);
    auVar239 = vfmadd231ps_fma(auVar150,auVar270,local_4e0._0_16_);
    auVar246 = vshufps_avx(auVar61,auVar61,0xe8);
    auVar108 = vshufps_avx(auVar239,auVar239,0xe8);
    auVar125 = vcmpps_avx(auVar246,auVar108,1);
    uVar54 = vextractps_avx(auVar125,0);
    auVar144 = auVar239;
    if ((uVar54 & 1) == 0) {
      auVar144 = auVar61;
    }
    auVar121._0_4_ = fVar118 * auVar79._16_4_ * 3.0;
    auVar121._4_4_ = fVar118 * fVar226;
    auVar121._8_4_ = fVar118 * auVar79._24_4_ * 3.0;
    auVar121._12_4_ = fVar118 * auVar224._28_4_;
    auVar181 = vsubps_avx((undefined1  [16])0x0,auVar121);
    auVar122 = vshufps_avx(auVar181,auVar181,0xb1);
    auVar145 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar186._0_4_ = fVar85 * auVar122._0_4_;
    auVar186._4_4_ = fVar87 * auVar122._4_4_;
    auVar186._8_4_ = fVar60 * auVar122._8_4_;
    auVar186._12_4_ = fVar159 * auVar122._12_4_;
    auVar201._0_4_ = auVar145._0_4_ * fVar85;
    auVar201._4_4_ = auVar145._4_4_ * fVar87;
    auVar201._8_4_ = auVar145._8_4_ * fVar60;
    auVar201._12_4_ = auVar145._12_4_ * fVar159;
    _local_5c0 = auVar181;
    auVar182 = vfmadd231ps_fma(auVar186,auVar270,auVar181);
    auVar210 = vfmadd231ps_fma(auVar201,(undefined1  [16])0x0,auVar270);
    auVar145 = vshufps_avx(auVar182,auVar182,0xe8);
    auVar160 = vshufps_avx(auVar210,auVar210,0xe8);
    auVar224 = ZEXT1664(auVar160);
    auVar122 = vcmpps_avx(auVar145,auVar160,1);
    uVar54 = vextractps_avx(auVar122,0);
    auVar211 = auVar210;
    if ((uVar54 & 1) == 0) {
      auVar211 = auVar182;
    }
    auVar144 = vmaxss_avx(auVar211,auVar144);
    auVar246 = vminps_avx(auVar246,auVar108);
    auVar108 = vminps_avx(auVar145,auVar160);
    auVar108 = vminps_avx(auVar246,auVar108);
    auVar125 = vshufps_avx(auVar125,auVar125,0x55);
    auVar125 = vblendps_avx(auVar125,auVar122,2);
    auVar122 = vpslld_avx(auVar125,0x1f);
    auVar125 = vshufpd_avx(auVar239,auVar239,1);
    auVar125 = vinsertps_avx(auVar125,auVar210,0x9c);
    auVar246 = vshufpd_avx(auVar61,auVar61,1);
    auVar246 = vinsertps_avx(auVar246,auVar182,0x9c);
    auVar125 = vblendvps_avx(auVar246,auVar125,auVar122);
    auVar246 = vmovshdup_avx(auVar125);
    auVar125 = vmaxss_avx(auVar246,auVar125);
    fVar60 = auVar108._0_4_;
    auVar246 = vmovshdup_avx(auVar108);
    fVar87 = auVar125._0_4_;
    fVar118 = auVar246._0_4_;
    fVar85 = auVar144._0_4_;
    if (((0.0001 <= fVar60) || (fVar87 <= -0.0001)) && (0.0001 <= fVar118 || fVar87 <= -0.0001))
    goto code_r0x011368ca;
    goto LAB_011368f0;
  }
  local_440 = vinsertps_avx(auVar9,auVar10,0x10);
  goto LAB_0113600a;
code_r0x011368ca:
  auVar246 = vcmpps_avx(auVar246,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar61 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar246 = vandps_avx(auVar61,auVar246);
  if (fVar85 <= -0.0001 || (auVar246 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_011365bc;
LAB_011368f0:
  auVar61 = vcmpps_avx(auVar108,_DAT_01f45a50,1);
  auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar246 = vcmpss_avx(auVar144,ZEXT816(0) << 0x20,1);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar246 = vblendvps_avx(auVar95,auVar112,auVar246);
  auVar61 = vblendvps_avx(auVar95,auVar112,auVar61);
  fVar226 = auVar61._0_4_;
  fVar159 = auVar246._0_4_;
  auVar246 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar226 == fVar159) && (!NAN(fVar226) && !NAN(fVar159))) {
    auVar246 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar226 == fVar159) && (!NAN(fVar226) && !NAN(fVar159))) {
    auVar239 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar61 = vmovshdup_avx(auVar61);
  fVar132 = auVar61._0_4_;
  if ((fVar226 != fVar132) || (NAN(fVar226) || NAN(fVar132))) {
    if ((fVar118 != fVar60) || (NAN(fVar118) || NAN(fVar60))) {
      auVar123._0_4_ = (float)((uint)fVar60 ^ local_510);
      auVar123._4_4_ = auVar108._4_4_ ^ uStack_50c;
      auVar123._8_4_ = auVar108._8_4_ ^ uStack_508;
      auVar123._12_4_ = auVar108._12_4_ ^ uStack_504;
      auVar124._0_4_ = auVar123._0_4_ / (fVar118 - fVar60);
      auVar124._4_12_ = auVar123._4_12_;
      auVar108 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar124,ZEXT416(0));
      auVar61 = auVar108;
    }
    else {
      auVar108 = ZEXT816(0) << 0x20;
      if ((fVar60 != 0.0) || (auVar61 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar60))) {
        auVar108 = SUB6416(ZEXT464(0x7f800000),0);
        auVar61 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar246 = vminss_avx(auVar246,auVar108);
    auVar239 = vmaxss_avx(auVar61,auVar239);
  }
  auVar125 = vcmpss_avx(auVar125,ZEXT416(0),1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar125 = vblendvps_avx(auVar96,auVar113,auVar125);
  fVar118 = auVar125._0_4_;
  if ((fVar159 != fVar118) || (NAN(fVar159) || NAN(fVar118))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar71._0_4_ = (float)((uint)fVar85 ^ local_510);
      auVar71._4_4_ = auVar144._4_4_ ^ uStack_50c;
      auVar71._8_4_ = auVar144._8_4_ ^ uStack_508;
      auVar71._12_4_ = auVar144._12_4_ ^ uStack_504;
      auVar126._0_4_ = auVar71._0_4_ / (fVar87 - fVar85);
      auVar126._4_12_ = auVar71._4_12_;
      auVar125 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar126,ZEXT416(0));
      auVar108 = auVar125;
    }
    else {
      auVar125 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar108 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar125 = SUB6416(ZEXT464(0xff800000),0);
        auVar108 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar246 = vminss_avx(auVar246,auVar108);
    auVar239 = vmaxss_avx(auVar125,auVar239);
  }
  if ((fVar132 != fVar118) || (NAN(fVar132) || NAN(fVar118))) {
    auVar246 = vminss_avx(auVar246,SUB6416(ZEXT464(0x3f800000),0));
    auVar239 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar239);
  }
  auVar125 = vmaxss_avx(ZEXT816(0) << 0x40,auVar246);
  auVar246 = vminss_avx(auVar239,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar246._0_4_ < auVar125._0_4_) goto LAB_011365bc;
  auVar125 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar125._0_4_ + -0.1)));
  auVar246 = vminss_avx(ZEXT416((uint)(auVar246._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar139._0_8_ = auVar134._0_8_;
  auVar139._8_8_ = auVar139._0_8_;
  auVar216._8_8_ = local_4e0._0_8_;
  auVar216._0_8_ = local_4e0._0_8_;
  auVar230._8_8_ = auVar181._0_8_;
  auVar230._0_8_ = auVar181._0_8_;
  auVar108 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar61 = vshufpd_avx(auVar181,auVar181,3);
  auVar239 = vshufps_avx(auVar125,auVar246,0);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar134 = vsubps_avx(auVar72,auVar239);
  local_640 = auVar63._0_4_;
  fStack_63c = auVar63._4_4_;
  fStack_638 = auVar63._8_4_;
  fStack_634 = auVar63._12_4_;
  fVar118 = auVar239._0_4_;
  auVar73._0_4_ = fVar118 * local_640;
  fVar85 = auVar239._4_4_;
  auVar73._4_4_ = fVar85 * fStack_63c;
  fVar87 = auVar239._8_4_;
  auVar73._8_4_ = fVar87 * fStack_638;
  fVar60 = auVar239._12_4_;
  auVar73._12_4_ = fVar60 * fStack_634;
  auVar174._0_4_ = fVar118 * auVar108._0_4_;
  auVar174._4_4_ = fVar85 * auVar108._4_4_;
  auVar174._8_4_ = fVar87 * auVar108._8_4_;
  auVar174._12_4_ = fVar60 * auVar108._12_4_;
  auVar187._0_4_ = fVar118 * auVar61._0_4_;
  auVar187._4_4_ = fVar85 * auVar61._4_4_;
  auVar187._8_4_ = fVar87 * auVar61._8_4_;
  auVar187._12_4_ = fVar60 * auVar61._12_4_;
  auVar202._0_4_ = fVar118 * auVar89._0_4_;
  auVar202._4_4_ = fVar85 * auVar89._4_4_;
  auVar202._8_4_ = fVar87 * auVar89._8_4_;
  auVar202._12_4_ = fVar60 * auVar89._12_4_;
  auVar108 = vfmadd231ps_fma(auVar73,auVar134,auVar139);
  auVar61 = vfmadd231ps_fma(auVar174,auVar134,auVar216);
  auVar239 = vfmadd231ps_fma(auVar187,auVar134,auVar230);
  auVar134 = vfmadd231ps_fma(auVar202,auVar134,ZEXT816(0));
  auVar63 = vmovshdup_avx(auVar66);
  auVar181 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar125._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar125._0_4_)));
  auVar182 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar246._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar246._0_4_)));
  fVar118 = 1.0 / fVar84;
  auVar125 = vsubps_avx(auVar61,auVar108);
  auVar217._0_4_ = auVar125._0_4_ * 3.0;
  auVar217._4_4_ = auVar125._4_4_ * 3.0;
  auVar217._8_4_ = auVar125._8_4_ * 3.0;
  auVar217._12_4_ = auVar125._12_4_ * 3.0;
  auVar125 = vsubps_avx(auVar239,auVar61);
  auVar231._0_4_ = auVar125._0_4_ * 3.0;
  auVar231._4_4_ = auVar125._4_4_ * 3.0;
  auVar231._8_4_ = auVar125._8_4_ * 3.0;
  auVar231._12_4_ = auVar125._12_4_ * 3.0;
  auVar125 = vsubps_avx(auVar134,auVar239);
  auVar240._0_4_ = auVar125._0_4_ * 3.0;
  auVar240._4_4_ = auVar125._4_4_ * 3.0;
  auVar240._8_4_ = auVar125._8_4_ * 3.0;
  auVar240._12_4_ = auVar125._12_4_ * 3.0;
  auVar63 = vminps_avx(auVar231,auVar240);
  auVar125 = vmaxps_avx(auVar231,auVar240);
  auVar63 = vminps_avx(auVar217,auVar63);
  auVar125 = vmaxps_avx(auVar217,auVar125);
  auVar89 = vshufpd_avx(auVar63,auVar63,3);
  auVar246 = vshufpd_avx(auVar125,auVar125,3);
  auVar63 = vminps_avx(auVar63,auVar89);
  auVar125 = vmaxps_avx(auVar125,auVar246);
  auVar232._0_4_ = auVar63._0_4_ * fVar118;
  auVar232._4_4_ = auVar63._4_4_ * fVar118;
  auVar232._8_4_ = auVar63._8_4_ * fVar118;
  auVar232._12_4_ = auVar63._12_4_ * fVar118;
  auVar218._0_4_ = auVar125._0_4_ * fVar118;
  auVar218._4_4_ = auVar125._4_4_ * fVar118;
  auVar218._8_4_ = auVar125._8_4_ * fVar118;
  auVar218._12_4_ = auVar125._12_4_ * fVar118;
  fVar118 = 1.0 / (auVar182._0_4_ - auVar181._0_4_);
  auVar125 = vshufpd_avx(auVar108,auVar108,3);
  auVar63 = vshufpd_avx(auVar61,auVar61,3);
  auVar89 = vshufpd_avx(auVar239,auVar239,3);
  auVar246 = vshufpd_avx(auVar134,auVar134,3);
  auVar125 = vsubps_avx(auVar125,auVar108);
  auVar108 = vsubps_avx(auVar63,auVar61);
  auVar61 = vsubps_avx(auVar89,auVar239);
  auVar246 = vsubps_avx(auVar246,auVar134);
  auVar63 = vminps_avx(auVar125,auVar108);
  auVar125 = vmaxps_avx(auVar125,auVar108);
  auVar89 = vminps_avx(auVar61,auVar246);
  auVar89 = vminps_avx(auVar63,auVar89);
  auVar63 = vmaxps_avx(auVar61,auVar246);
  auVar125 = vmaxps_avx(auVar125,auVar63);
  auVar258._0_4_ = fVar118 * auVar89._0_4_;
  auVar258._4_4_ = fVar118 * auVar89._4_4_;
  auVar258._8_4_ = fVar118 * auVar89._8_4_;
  auVar258._12_4_ = fVar118 * auVar89._12_4_;
  auVar247._0_4_ = fVar118 * auVar125._0_4_;
  auVar247._4_4_ = fVar118 * auVar125._4_4_;
  auVar247._8_4_ = fVar118 * auVar125._8_4_;
  auVar247._12_4_ = fVar118 * auVar125._12_4_;
  auVar246 = vinsertps_avx(auVar9,auVar181,0x10);
  auVar108 = vinsertps_avx(auVar10,auVar182,0x10);
  auVar241._0_4_ = (auVar246._0_4_ + auVar108._0_4_) * 0.5;
  auVar241._4_4_ = (auVar246._4_4_ + auVar108._4_4_) * 0.5;
  auVar241._8_4_ = (auVar246._8_4_ + auVar108._8_4_) * 0.5;
  auVar241._12_4_ = (auVar246._12_4_ + auVar108._12_4_) * 0.5;
  auVar74._4_4_ = auVar241._0_4_;
  auVar74._0_4_ = auVar241._0_4_;
  auVar74._8_4_ = auVar241._0_4_;
  auVar74._12_4_ = auVar241._0_4_;
  auVar125 = vfmadd213ps_fma(local_390,auVar74,auVar12);
  auVar63 = vfmadd213ps_fma(local_3a0,auVar74,auVar13);
  auVar89 = vfmadd213ps_fma(local_3b0,auVar74,auVar14);
  auVar10 = vsubps_avx(auVar63,auVar125);
  auVar125 = vfmadd213ps_fma(auVar10,auVar74,auVar125);
  auVar10 = vsubps_avx(auVar89,auVar63);
  auVar10 = vfmadd213ps_fma(auVar10,auVar74,auVar63);
  auVar10 = vsubps_avx(auVar10,auVar125);
  auVar125 = vfmadd231ps_fma(auVar125,auVar10,auVar74);
  auVar75._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
  auVar75._8_4_ = auVar10._8_4_ * 3.0;
  auVar75._12_4_ = auVar10._12_4_ * 3.0;
  auVar271._8_8_ = auVar125._0_8_;
  auVar271._0_8_ = auVar125._0_8_;
  auVar10 = vshufpd_avx(auVar125,auVar125,3);
  auVar125 = vshufps_avx(auVar241,auVar241,0x55);
  auVar239 = vsubps_avx(auVar10,auVar271);
  auVar144 = vfmadd231ps_fma(auVar271,auVar125,auVar239);
  auVar277._8_8_ = auVar75._0_8_;
  auVar277._0_8_ = auVar75._0_8_;
  auVar10 = vshufpd_avx(auVar75,auVar75,3);
  auVar10 = vsubps_avx(auVar10,auVar277);
  auVar134 = vfmadd213ps_fma(auVar10,auVar125,auVar277);
  auVar125 = vmovshdup_avx(auVar134);
  auVar278._0_8_ = auVar125._0_8_ ^ 0x8000000080000000;
  auVar278._8_4_ = auVar125._8_4_ ^ 0x80000000;
  auVar278._12_4_ = auVar125._12_4_ ^ 0x80000000;
  auVar63 = vmovshdup_avx(auVar239);
  auVar10 = vunpcklps_avx(auVar63,auVar278);
  auVar89 = vshufps_avx(auVar10,auVar278,4);
  auVar61 = vshufps_avx(auVar241,auVar241,0x54);
  auVar127._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
  auVar127._8_4_ = auVar239._8_4_ ^ 0x80000000;
  auVar127._12_4_ = auVar239._12_4_ ^ 0x80000000;
  auVar10 = vmovlhps_avx(auVar127,auVar134);
  auVar10 = vshufps_avx(auVar10,auVar134,8);
  auVar125 = vfmsub231ss_fma(ZEXT416((uint)(auVar239._0_4_ * auVar125._0_4_)),auVar63,auVar134);
  uVar58 = auVar125._0_4_;
  auVar76._4_4_ = uVar58;
  auVar76._0_4_ = uVar58;
  auVar76._8_4_ = uVar58;
  auVar76._12_4_ = uVar58;
  auVar125 = vdivps_avx(auVar89,auVar76);
  auVar63 = vdivps_avx(auVar10,auVar76);
  fVar87 = auVar144._0_4_;
  fVar118 = auVar125._0_4_;
  auVar10 = vshufps_avx(auVar144,auVar144,0x55);
  fVar85 = auVar63._0_4_;
  auVar77._0_4_ = fVar87 * fVar118 + auVar10._0_4_ * fVar85;
  auVar77._4_4_ = fVar87 * auVar125._4_4_ + auVar10._4_4_ * auVar63._4_4_;
  auVar77._8_4_ = fVar87 * auVar125._8_4_ + auVar10._8_4_ * auVar63._8_4_;
  auVar77._12_4_ = fVar87 * auVar125._12_4_ + auVar10._12_4_ * auVar63._12_4_;
  auVar160 = vsubps_avx(auVar61,auVar77);
  auVar61 = vmovshdup_avx(auVar125);
  auVar10 = vinsertps_avx(auVar232,auVar258,0x1c);
  auVar151._0_4_ = auVar61._0_4_ * auVar10._0_4_;
  auVar151._4_4_ = auVar61._4_4_ * auVar10._4_4_;
  auVar151._8_4_ = auVar61._8_4_ * auVar10._8_4_;
  auVar151._12_4_ = auVar61._12_4_ * auVar10._12_4_;
  auVar89 = vinsertps_avx(auVar218,auVar247,0x1c);
  auVar97._0_4_ = auVar89._0_4_ * auVar61._0_4_;
  auVar97._4_4_ = auVar89._4_4_ * auVar61._4_4_;
  auVar97._8_4_ = auVar89._8_4_ * auVar61._8_4_;
  auVar97._12_4_ = auVar89._12_4_ * auVar61._12_4_;
  auVar144 = vminps_avx(auVar151,auVar97);
  auVar134 = vmaxps_avx(auVar97,auVar151);
  auVar61 = vinsertps_avx(auVar258,auVar232,0x4c);
  auVar122 = vmovshdup_avx(auVar63);
  auVar239 = vinsertps_avx(auVar247,auVar218,0x4c);
  auVar248._0_4_ = auVar122._0_4_ * auVar61._0_4_;
  auVar248._4_4_ = auVar122._4_4_ * auVar61._4_4_;
  auVar248._8_4_ = auVar122._8_4_ * auVar61._8_4_;
  auVar248._12_4_ = auVar122._12_4_ * auVar61._12_4_;
  auVar233._0_4_ = auVar122._0_4_ * auVar239._0_4_;
  auVar233._4_4_ = auVar122._4_4_ * auVar239._4_4_;
  auVar233._8_4_ = auVar122._8_4_ * auVar239._8_4_;
  auVar233._12_4_ = auVar122._12_4_ * auVar239._12_4_;
  auVar122 = vminps_avx(auVar248,auVar233);
  auVar259._0_4_ = auVar144._0_4_ + auVar122._0_4_;
  auVar259._4_4_ = auVar144._4_4_ + auVar122._4_4_;
  auVar259._8_4_ = auVar144._8_4_ + auVar122._8_4_;
  auVar259._12_4_ = auVar144._12_4_ + auVar122._12_4_;
  auVar144 = vmaxps_avx(auVar233,auVar248);
  auVar98._0_4_ = auVar144._0_4_ + auVar134._0_4_;
  auVar98._4_4_ = auVar144._4_4_ + auVar134._4_4_;
  auVar98._8_4_ = auVar144._8_4_ + auVar134._8_4_;
  auVar98._12_4_ = auVar144._12_4_ + auVar134._12_4_;
  auVar234._8_8_ = 0x3f80000000000000;
  auVar234._0_8_ = 0x3f80000000000000;
  auVar134 = vsubps_avx(auVar234,auVar98);
  auVar144 = vsubps_avx(auVar234,auVar259);
  auVar122 = vsubps_avx(auVar246,auVar241);
  auVar145 = vsubps_avx(auVar108,auVar241);
  auVar114._0_4_ = fVar118 * auVar10._0_4_;
  auVar114._4_4_ = fVar118 * auVar10._4_4_;
  auVar114._8_4_ = fVar118 * auVar10._8_4_;
  auVar114._12_4_ = fVar118 * auVar10._12_4_;
  auVar260._0_4_ = fVar118 * auVar89._0_4_;
  auVar260._4_4_ = fVar118 * auVar89._4_4_;
  auVar260._8_4_ = fVar118 * auVar89._8_4_;
  auVar260._12_4_ = fVar118 * auVar89._12_4_;
  auVar89 = vminps_avx(auVar114,auVar260);
  auVar10 = vmaxps_avx(auVar260,auVar114);
  auVar152._0_4_ = fVar85 * auVar61._0_4_;
  auVar152._4_4_ = fVar85 * auVar61._4_4_;
  auVar152._8_4_ = fVar85 * auVar61._8_4_;
  auVar152._12_4_ = fVar85 * auVar61._12_4_;
  auVar219._0_4_ = fVar85 * auVar239._0_4_;
  auVar219._4_4_ = fVar85 * auVar239._4_4_;
  auVar219._8_4_ = fVar85 * auVar239._8_4_;
  auVar219._12_4_ = fVar85 * auVar239._12_4_;
  auVar61 = vminps_avx(auVar152,auVar219);
  auVar261._0_4_ = auVar89._0_4_ + auVar61._0_4_;
  auVar261._4_4_ = auVar89._4_4_ + auVar61._4_4_;
  auVar261._8_4_ = auVar89._8_4_ + auVar61._8_4_;
  auVar261._12_4_ = auVar89._12_4_ + auVar61._12_4_;
  fVar132 = auVar122._0_4_;
  auVar272._0_4_ = fVar132 * auVar134._0_4_;
  fVar265 = auVar122._4_4_;
  auVar272._4_4_ = fVar265 * auVar134._4_4_;
  fVar266 = auVar122._8_4_;
  auVar272._8_4_ = fVar266 * auVar134._8_4_;
  fVar192 = auVar122._12_4_;
  auVar272._12_4_ = fVar192 * auVar134._12_4_;
  auVar89 = vmaxps_avx(auVar219,auVar152);
  auVar220._0_4_ = fVar132 * auVar144._0_4_;
  auVar220._4_4_ = fVar265 * auVar144._4_4_;
  auVar220._8_4_ = fVar266 * auVar144._8_4_;
  auVar220._12_4_ = fVar192 * auVar144._12_4_;
  fVar87 = auVar145._0_4_;
  auVar99._0_4_ = fVar87 * auVar134._0_4_;
  fVar60 = auVar145._4_4_;
  auVar99._4_4_ = fVar60 * auVar134._4_4_;
  fVar159 = auVar145._8_4_;
  auVar99._8_4_ = fVar159 * auVar134._8_4_;
  fVar226 = auVar145._12_4_;
  auVar99._12_4_ = fVar226 * auVar134._12_4_;
  auVar235._0_4_ = fVar87 * auVar144._0_4_;
  auVar235._4_4_ = fVar60 * auVar144._4_4_;
  auVar235._8_4_ = fVar159 * auVar144._8_4_;
  auVar235._12_4_ = fVar226 * auVar144._12_4_;
  auVar115._0_4_ = auVar10._0_4_ + auVar89._0_4_;
  auVar115._4_4_ = auVar10._4_4_ + auVar89._4_4_;
  auVar115._8_4_ = auVar10._8_4_ + auVar89._8_4_;
  auVar115._12_4_ = auVar10._12_4_ + auVar89._12_4_;
  auVar153._8_8_ = 0x3f800000;
  auVar153._0_8_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar153,auVar115);
  auVar89 = vsubps_avx(auVar153,auVar261);
  auVar262._0_4_ = fVar132 * auVar10._0_4_;
  auVar262._4_4_ = fVar265 * auVar10._4_4_;
  auVar262._8_4_ = fVar266 * auVar10._8_4_;
  auVar262._12_4_ = fVar192 * auVar10._12_4_;
  auVar249._0_4_ = fVar132 * auVar89._0_4_;
  auVar249._4_4_ = fVar265 * auVar89._4_4_;
  auVar249._8_4_ = fVar266 * auVar89._8_4_;
  auVar249._12_4_ = fVar192 * auVar89._12_4_;
  auVar116._0_4_ = fVar87 * auVar10._0_4_;
  auVar116._4_4_ = fVar60 * auVar10._4_4_;
  auVar116._8_4_ = fVar159 * auVar10._8_4_;
  auVar116._12_4_ = fVar226 * auVar10._12_4_;
  auVar154._0_4_ = fVar87 * auVar89._0_4_;
  auVar154._4_4_ = fVar60 * auVar89._4_4_;
  auVar154._8_4_ = fVar159 * auVar89._8_4_;
  auVar154._12_4_ = fVar226 * auVar89._12_4_;
  auVar10 = vminps_avx(auVar262,auVar249);
  auVar89 = vminps_avx(auVar116,auVar154);
  auVar10 = vminps_avx(auVar10,auVar89);
  auVar89 = vmaxps_avx(auVar249,auVar262);
  auVar61 = vmaxps_avx(auVar154,auVar116);
  auVar239 = vminps_avx(auVar272,auVar220);
  auVar134 = vminps_avx(auVar99,auVar235);
  auVar239 = vminps_avx(auVar239,auVar134);
  auVar10 = vhaddps_avx(auVar10,auVar239);
  auVar89 = vmaxps_avx(auVar61,auVar89);
  auVar61 = vmaxps_avx(auVar220,auVar272);
  auVar239 = vmaxps_avx(auVar235,auVar99);
  auVar61 = vmaxps_avx(auVar239,auVar61);
  auVar89 = vhaddps_avx(auVar89,auVar61);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar89 = vshufps_avx(auVar89,auVar89,0xe8);
  auVar236._0_4_ = auVar160._0_4_ + auVar10._0_4_;
  auVar236._4_4_ = auVar160._4_4_ + auVar10._4_4_;
  auVar236._8_4_ = auVar160._8_4_ + auVar10._8_4_;
  auVar236._12_4_ = auVar160._12_4_ + auVar10._12_4_;
  auVar221._0_4_ = auVar160._0_4_ + auVar89._0_4_;
  auVar221._4_4_ = auVar160._4_4_ + auVar89._4_4_;
  auVar221._8_4_ = auVar160._8_4_ + auVar89._8_4_;
  auVar221._12_4_ = auVar160._12_4_ + auVar89._12_4_;
  auVar224 = ZEXT1664(auVar221);
  auVar10 = vmaxps_avx(auVar246,auVar236);
  auVar89 = vminps_avx(auVar221,auVar108);
  auVar10 = vcmpps_avx(auVar89,auVar10,1);
  auVar10 = vshufps_avx(auVar10,auVar10,0x50);
  if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar10[0xf] < '\0')
  goto LAB_011365bc;
  bVar52 = 0;
  if ((auVar191._0_4_ < auVar236._0_4_) && (bVar52 = 0, auVar221._0_4_ < auVar108._0_4_)) {
    auVar89 = vmovshdup_avx(auVar236);
    auVar10 = vcmpps_avx(auVar221,auVar108,1);
    bVar52 = auVar10[4] & auVar181._0_4_ < auVar89._0_4_;
  }
  if (((3 < (uint)uVar57 || fVar84 < 0.001) | bVar52) == 1) {
    lVar51 = 0xc9;
    auVar224 = ZEXT464(0x40400000);
    do {
      lVar51 = lVar51 + -1;
      if (lVar51 == 0) goto LAB_011365bc;
      fVar60 = auVar160._0_4_;
      fVar87 = 1.0 - fVar60;
      fVar84 = fVar87 * fVar87 * fVar87;
      fVar86 = fVar60 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar60 * fVar60 * 3.0;
      auVar140._4_4_ = fVar84;
      auVar140._0_4_ = fVar84;
      auVar140._8_4_ = fVar84;
      auVar140._12_4_ = fVar84;
      auVar117._4_4_ = fVar86;
      auVar117._0_4_ = fVar86;
      auVar117._8_4_ = fVar86;
      auVar117._12_4_ = fVar86;
      auVar100._4_4_ = fVar87;
      auVar100._0_4_ = fVar87;
      auVar100._8_4_ = fVar87;
      auVar100._12_4_ = fVar87;
      fVar60 = fVar60 * fVar60 * fVar60;
      auVar155._0_4_ = (float)local_3c0._0_4_ * fVar60;
      auVar155._4_4_ = (float)local_3c0._4_4_ * fVar60;
      auVar155._8_4_ = fStack_3b8 * fVar60;
      auVar155._12_4_ = fStack_3b4 * fVar60;
      auVar9 = vfmadd231ps_fma(auVar155,auVar14,auVar100);
      auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar117);
      auVar9 = vfmadd231ps_fma(auVar9,auVar12,auVar140);
      auVar101._8_8_ = auVar9._0_8_;
      auVar101._0_8_ = auVar9._0_8_;
      auVar9 = vshufpd_avx(auVar9,auVar9,3);
      auVar10 = vshufps_avx(auVar160,auVar160,0x55);
      auVar9 = vsubps_avx(auVar9,auVar101);
      auVar10 = vfmadd213ps_fma(auVar9,auVar10,auVar101);
      fVar84 = auVar10._0_4_;
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar102._0_4_ = fVar118 * fVar84 + fVar85 * auVar9._0_4_;
      auVar102._4_4_ = auVar125._4_4_ * fVar84 + auVar63._4_4_ * auVar9._4_4_;
      auVar102._8_4_ = auVar125._8_4_ * fVar84 + auVar63._8_4_ * auVar9._8_4_;
      auVar102._12_4_ = auVar125._12_4_ * fVar84 + auVar63._12_4_ * auVar9._12_4_;
      auVar160 = vsubps_avx(auVar160,auVar102);
      auVar9 = vandps_avx(local_500,auVar10);
      auVar10 = vshufps_avx(auVar9,auVar9,0xf5);
      auVar9 = vmaxss_avx(auVar10,auVar9);
    } while ((float)local_3d0._0_4_ <= auVar9._0_4_);
    local_120 = auVar160._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar9 = vmovshdup_avx(auVar160);
      fVar84 = auVar9._0_4_;
      if ((0.0 <= fVar84) && (fVar84 <= 1.0)) {
        auVar10 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar239 = vinsertps_avx(auVar10,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar10 = vdpps_avx(auVar239,local_520,0x7f);
        auVar125 = vdpps_avx(auVar239,local_530,0x7f);
        auVar63 = vdpps_avx(auVar239,local_3e0,0x7f);
        auVar89 = vdpps_avx(auVar239,local_3f0,0x7f);
        auVar246 = vdpps_avx(auVar239,local_400,0x7f);
        auVar108 = vdpps_avx(auVar239,local_410,0x7f);
        auVar61 = vdpps_avx(auVar239,local_420,0x7f);
        auVar239 = vdpps_avx(auVar239,local_430,0x7f);
        fVar86 = 1.0 - fVar84;
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar246._0_4_)),ZEXT416((uint)fVar86),
                                  auVar10);
        auVar125 = vfmadd231ss_fma(ZEXT416((uint)(auVar108._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                   auVar125);
        auVar224 = ZEXT1664(auVar125);
        auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                  auVar63);
        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar239._0_4_)),ZEXT416((uint)fVar86),
                                  auVar89);
        fVar87 = 1.0 - local_120;
        fVar86 = fVar87 * local_120 * local_120 * 3.0;
        fVar159 = local_120 * local_120 * local_120;
        auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * auVar89._0_4_)),ZEXT416((uint)fVar86),
                                  auVar63);
        fVar118 = local_120 * 3.0 * fVar87 * fVar87;
        auVar125 = vfmadd231ss_fma(auVar63,ZEXT416((uint)fVar118),auVar125);
        fVar85 = fVar87 * fVar87 * fVar87;
        auVar10 = vfmadd231ss_fma(auVar125,ZEXT416((uint)fVar85),auVar10);
        fVar60 = auVar10._0_4_;
        if (((fVar59 <= fVar60) && (fVar226 = *(float *)(ray + k * 4 + 0x100), fVar60 <= fVar226))
           && (pGVar5 = (context->scene->geometries).items[uVar49].ptr,
              (pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar10 = vshufps_avx(auVar160,auVar160,0x55);
          auVar222._8_4_ = 0x3f800000;
          auVar222._0_8_ = 0x3f8000003f800000;
          auVar222._12_4_ = 0x3f800000;
          auVar125 = vsubps_avx(auVar222,auVar10);
          fVar132 = auVar10._0_4_;
          auVar237._0_4_ = fVar132 * (float)local_550._0_4_;
          fVar265 = auVar10._4_4_;
          auVar237._4_4_ = fVar265 * (float)local_550._4_4_;
          fVar266 = auVar10._8_4_;
          auVar237._8_4_ = fVar266 * fStack_548;
          fVar192 = auVar10._12_4_;
          auVar237._12_4_ = fVar192 * fStack_544;
          auVar242._0_4_ = fVar132 * (float)local_590._0_4_;
          auVar242._4_4_ = fVar265 * (float)local_590._4_4_;
          auVar242._8_4_ = fVar266 * fStack_588;
          auVar242._12_4_ = fVar192 * fStack_584;
          auVar250._0_4_ = fVar132 * (float)local_5a0._0_4_;
          auVar250._4_4_ = fVar265 * (float)local_5a0._4_4_;
          auVar250._8_4_ = fVar266 * fStack_598;
          auVar250._12_4_ = fVar192 * fStack_594;
          auVar203._0_4_ = fVar132 * fVar158;
          auVar203._4_4_ = fVar265 * fVar178;
          auVar203._8_4_ = fVar266 * fVar179;
          auVar203._12_4_ = fVar192 * fVar180;
          auVar10 = vfmadd231ps_fma(auVar237,auVar125,local_540);
          auVar63 = vfmadd231ps_fma(auVar242,auVar125,local_570);
          auVar89 = vfmadd231ps_fma(auVar250,auVar125,local_580);
          auVar246 = vfmadd231ps_fma(auVar203,auVar125,local_560);
          auVar125 = vsubps_avx(auVar63,auVar10);
          auVar224 = ZEXT1664(auVar125);
          auVar10 = vsubps_avx(auVar89,auVar63);
          auVar63 = vsubps_avx(auVar246,auVar89);
          auVar251._0_4_ = local_120 * auVar10._0_4_;
          auVar251._4_4_ = local_120 * auVar10._4_4_;
          auVar251._8_4_ = local_120 * auVar10._8_4_;
          auVar251._12_4_ = local_120 * auVar10._12_4_;
          auVar188._4_4_ = fVar87;
          auVar188._0_4_ = fVar87;
          auVar188._8_4_ = fVar87;
          auVar188._12_4_ = fVar87;
          auVar89 = vfmadd231ps_fma(auVar251,auVar188,auVar125);
          auVar204._0_4_ = local_120 * auVar63._0_4_;
          auVar204._4_4_ = local_120 * auVar63._4_4_;
          auVar204._8_4_ = local_120 * auVar63._8_4_;
          auVar204._12_4_ = local_120 * auVar63._12_4_;
          auVar10 = vfmadd231ps_fma(auVar204,auVar188,auVar10);
          auVar205._0_4_ = local_120 * auVar10._0_4_;
          auVar205._4_4_ = local_120 * auVar10._4_4_;
          auVar205._8_4_ = local_120 * auVar10._8_4_;
          auVar205._12_4_ = local_120 * auVar10._12_4_;
          auVar63 = vfmadd231ps_fma(auVar205,auVar188,auVar89);
          auVar175._0_4_ = fVar159 * (float)local_480._0_4_;
          auVar175._4_4_ = fVar159 * (float)local_480._4_4_;
          auVar175._8_4_ = fVar159 * fStack_478;
          auVar175._12_4_ = fVar159 * fStack_474;
          auVar128._4_4_ = fVar86;
          auVar128._0_4_ = fVar86;
          auVar128._8_4_ = fVar86;
          auVar128._12_4_ = fVar86;
          auVar10 = vfmadd132ps_fma(auVar128,auVar175,local_470);
          auVar156._4_4_ = fVar118;
          auVar156._0_4_ = fVar118;
          auVar156._8_4_ = fVar118;
          auVar156._12_4_ = fVar118;
          auVar10 = vfmadd132ps_fma(auVar156,auVar10,local_460);
          auVar176._0_4_ = auVar63._0_4_ * 3.0;
          auVar176._4_4_ = auVar63._4_4_ * 3.0;
          auVar176._8_4_ = auVar63._8_4_ * 3.0;
          auVar176._12_4_ = auVar63._12_4_ * 3.0;
          auVar141._4_4_ = fVar85;
          auVar141._0_4_ = fVar85;
          auVar141._8_4_ = fVar85;
          auVar141._12_4_ = fVar85;
          auVar63 = vfmadd132ps_fma(auVar141,auVar10,local_450);
          auVar10 = vshufps_avx(auVar176,auVar176,0xc9);
          auVar129._0_4_ = auVar63._0_4_ * auVar10._0_4_;
          auVar129._4_4_ = auVar63._4_4_ * auVar10._4_4_;
          auVar129._8_4_ = auVar63._8_4_ * auVar10._8_4_;
          auVar129._12_4_ = auVar63._12_4_ * auVar10._12_4_;
          auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
          auVar10 = vfmsub231ps_fma(auVar129,auVar176,auVar10);
          local_140 = auVar10._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar60;
            uVar58 = vextractps_avx(auVar10,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar58;
            uVar58 = vextractps_avx(auVar10,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar58;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar84;
            *(uint *)(ray + k * 4 + 0x220) = uVar4;
            *(uint *)(ray + k * 4 + 0x240) = uVar49;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_011365bc;
          }
          local_100 = auVar9._0_8_;
          auVar9 = vmovshdup_avx(auVar10);
          local_180 = auVar9._0_8_;
          auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
          local_160 = auVar9._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_33c,local_340);
          uStack_d8 = CONCAT44(uStack_334,uStack_338);
          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
          uStack_c8 = CONCAT44(uStack_324,uStack_328);
          local_c0._4_4_ = uStack_31c;
          local_c0._0_4_ = local_320;
          local_c0._8_4_ = uStack_318;
          local_c0._12_4_ = uStack_314;
          local_c0._16_4_ = uStack_310;
          local_c0._20_4_ = uStack_30c;
          local_c0._24_4_ = uStack_308;
          local_c0._28_4_ = uStack_304;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar60;
          local_4c0 = local_360;
          local_5f0.valid = (int *)local_4c0;
          local_5f0.geometryUserPtr = pGVar5->userPtr;
          local_5f0.context = context->user;
          local_5f0.hit = (RTCHitN *)&local_180;
          local_5f0.N = 8;
          local_5f0.ray = (RTCRayN *)ray;
          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar224 = ZEXT1664(auVar125);
            (*pGVar5->intersectionFilterN)(&local_5f0);
          }
          auVar79 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
          auVar79 = _DAT_01f7b020 & ~auVar79;
          if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0x7f,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar79 >> 0xbf,0) != '\0') ||
              (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar79[0x1f] < '\0') {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              auVar224 = ZEXT1664(auVar224._0_16_);
              (*p_Var6)(&local_5f0);
            }
            auVar16 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
            auVar79 = _DAT_01f7b020 & ~auVar16;
            if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar79 >> 0x7f,0) != '\0') ||
                  (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0xbf,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar79[0x1f] < '\0') {
              auVar83._0_8_ = auVar16._0_8_ ^ 0xffffffffffffffff;
              auVar83._8_4_ = auVar16._8_4_ ^ 0xffffffff;
              auVar83._12_4_ = auVar16._12_4_ ^ 0xffffffff;
              auVar83._16_4_ = auVar16._16_4_ ^ 0xffffffff;
              auVar83._20_4_ = auVar16._20_4_ ^ 0xffffffff;
              auVar83._24_4_ = auVar16._24_4_ ^ 0xffffffff;
              auVar83._28_4_ = auVar16._28_4_ ^ 0xffffffff;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])local_5f0.hit);
              *(undefined1 (*) [32])(local_5f0.ray + 0x180) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x20));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1a0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x40));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1c0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x60));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1e0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x80));
              *(undefined1 (*) [32])(local_5f0.ray + 0x200) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xa0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x220) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xc0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x240) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xe0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x260) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x100));
              *(undefined1 (*) [32])(local_5f0.ray + 0x280) = auVar79;
              goto LAB_011365bc;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar226;
        }
      }
    }
    goto LAB_011365bc;
  }
  local_440 = vinsertps_avx(auVar9,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar181,ZEXT416((uint)auVar182._0_4_),0x10);
  goto LAB_0113600a;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }